

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  float fVar90;
  undefined4 uVar91;
  float fVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float t1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vfloat4 b0;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  vfloat4 b0_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  vfloat4 a0_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar197;
  float fVar199;
  vfloat4 a0_1;
  float fVar201;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar198;
  float fVar200;
  float fVar202;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar213;
  float fVar214;
  vfloat4 a0;
  float fVar215;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  ulong local_2f0;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  RTCFilterFunctionNArguments local_278;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  uint auStack_188 [4];
  undefined8 local_178;
  float local_170;
  undefined8 local_16c;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar25;
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar226 [32];
  
  PVar4 = prim[1];
  uVar31 = (ulong)(byte)PVar4;
  fVar205 = *(float *)(prim + uVar31 * 0x19 + 0x12);
  auVar72._16_16_ =
       vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                  *(undefined1 (*) [16])(prim + uVar31 * 0x19 + 6));
  fVar108 = fVar205 * auVar72._16_4_;
  fVar90 = fVar205 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar31 * 4 + 6);
  auVar59 = vpmovsxbd_avx2(auVar36);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar31 * 5 + 6);
  auVar57 = vpmovsxbd_avx2(auVar47);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar31 * 6 + 6);
  auVar64 = vpmovsxbd_avx2(auVar46);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar31 * 0xb + 6);
  auVar74 = vpmovsxbd_avx2(auVar45);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar68 = vpmovsxbd_avx2(auVar44);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75 = vcvtdq2ps_avx(auVar68);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar31 + 6);
  auVar58 = vpmovsxbd_avx2(auVar43);
  auVar58 = vcvtdq2ps_avx(auVar58);
  uVar30 = (ulong)(uint)((int)(uVar31 * 9) * 2);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar30 + 6);
  auVar65 = vpmovsxbd_avx2(auVar42);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar30 + uVar31 + 6);
  auVar66 = vpmovsxbd_avx2(auVar41);
  auVar66 = vcvtdq2ps_avx(auVar66);
  uVar24 = (ulong)(uint)((int)(uVar31 * 5) << 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar24 + 6);
  auVar56 = vpmovsxbd_avx2(auVar38);
  auVar67 = vcvtdq2ps_avx(auVar56);
  auVar220._4_4_ = fVar90;
  auVar220._0_4_ = fVar90;
  auVar220._8_4_ = fVar90;
  auVar220._12_4_ = fVar90;
  auVar220._16_4_ = fVar90;
  auVar220._20_4_ = fVar90;
  auVar220._24_4_ = fVar90;
  auVar220._28_4_ = fVar90;
  auVar232._8_4_ = 1;
  auVar232._0_8_ = 0x100000001;
  auVar232._12_4_ = 1;
  auVar232._16_4_ = 1;
  auVar232._20_4_ = 1;
  auVar232._24_4_ = 1;
  auVar232._28_4_ = 1;
  auVar54 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar70 = ZEXT1632(CONCAT412(fVar205 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar205 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar205 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar90))));
  auVar69 = vpermps_avx2(auVar232,auVar70);
  auVar55 = vpermps_avx512vl(auVar54,auVar70);
  fVar90 = auVar55._0_4_;
  fVar198 = auVar55._4_4_;
  auVar70._4_4_ = fVar198 * auVar64._4_4_;
  auVar70._0_4_ = fVar90 * auVar64._0_4_;
  fVar200 = auVar55._8_4_;
  auVar70._8_4_ = fVar200 * auVar64._8_4_;
  fVar202 = auVar55._12_4_;
  auVar70._12_4_ = fVar202 * auVar64._12_4_;
  fVar203 = auVar55._16_4_;
  auVar70._16_4_ = fVar203 * auVar64._16_4_;
  fVar204 = auVar55._20_4_;
  auVar70._20_4_ = fVar204 * auVar64._20_4_;
  fVar96 = auVar55._24_4_;
  auVar70._24_4_ = fVar96 * auVar64._24_4_;
  auVar70._28_4_ = auVar68._28_4_;
  auVar68._4_4_ = auVar58._4_4_ * fVar198;
  auVar68._0_4_ = auVar58._0_4_ * fVar90;
  auVar68._8_4_ = auVar58._8_4_ * fVar200;
  auVar68._12_4_ = auVar58._12_4_ * fVar202;
  auVar68._16_4_ = auVar58._16_4_ * fVar203;
  auVar68._20_4_ = auVar58._20_4_ * fVar204;
  auVar68._24_4_ = auVar58._24_4_ * fVar96;
  auVar68._28_4_ = auVar56._28_4_;
  auVar56._4_4_ = auVar67._4_4_ * fVar198;
  auVar56._0_4_ = auVar67._0_4_ * fVar90;
  auVar56._8_4_ = auVar67._8_4_ * fVar200;
  auVar56._12_4_ = auVar67._12_4_ * fVar202;
  auVar56._16_4_ = auVar67._16_4_ * fVar203;
  auVar56._20_4_ = auVar67._20_4_ * fVar204;
  auVar56._24_4_ = auVar67._24_4_ * fVar96;
  auVar56._28_4_ = auVar55._28_4_;
  auVar36 = vfmadd231ps_fma(auVar70,auVar69,auVar57);
  auVar47 = vfmadd231ps_fma(auVar68,auVar69,auVar75);
  auVar46 = vfmadd231ps_fma(auVar56,auVar66,auVar69);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar220,auVar59);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar220,auVar74);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar65,auVar220);
  auVar221._4_4_ = fVar108;
  auVar221._0_4_ = fVar108;
  auVar221._8_4_ = fVar108;
  auVar221._12_4_ = fVar108;
  auVar221._16_4_ = fVar108;
  auVar221._20_4_ = fVar108;
  auVar221._24_4_ = fVar108;
  auVar221._28_4_ = fVar108;
  auVar56 = ZEXT1632(CONCAT412(fVar205 * auVar72._28_4_,
                               CONCAT48(fVar205 * auVar72._24_4_,
                                        CONCAT44(fVar205 * auVar72._20_4_,fVar108))));
  auVar68 = vpermps_avx2(auVar232,auVar56);
  auVar56 = vpermps_avx512vl(auVar54,auVar56);
  fVar205 = auVar56._0_4_;
  fVar90 = auVar56._4_4_;
  auVar69._4_4_ = fVar90 * auVar64._4_4_;
  auVar69._0_4_ = fVar205 * auVar64._0_4_;
  fVar198 = auVar56._8_4_;
  auVar69._8_4_ = fVar198 * auVar64._8_4_;
  fVar200 = auVar56._12_4_;
  auVar69._12_4_ = fVar200 * auVar64._12_4_;
  fVar202 = auVar56._16_4_;
  auVar69._16_4_ = fVar202 * auVar64._16_4_;
  fVar203 = auVar56._20_4_;
  auVar69._20_4_ = fVar203 * auVar64._20_4_;
  fVar204 = auVar56._24_4_;
  auVar69._24_4_ = fVar204 * auVar64._24_4_;
  auVar69._28_4_ = 1;
  auVar54._4_4_ = auVar58._4_4_ * fVar90;
  auVar54._0_4_ = auVar58._0_4_ * fVar205;
  auVar54._8_4_ = auVar58._8_4_ * fVar198;
  auVar54._12_4_ = auVar58._12_4_ * fVar200;
  auVar54._16_4_ = auVar58._16_4_ * fVar202;
  auVar54._20_4_ = auVar58._20_4_ * fVar203;
  auVar54._24_4_ = auVar58._24_4_ * fVar204;
  auVar54._28_4_ = auVar64._28_4_;
  auVar58._4_4_ = auVar67._4_4_ * fVar90;
  auVar58._0_4_ = auVar67._0_4_ * fVar205;
  auVar58._8_4_ = auVar67._8_4_ * fVar198;
  auVar58._12_4_ = auVar67._12_4_ * fVar200;
  auVar58._16_4_ = auVar67._16_4_ * fVar202;
  auVar58._20_4_ = auVar67._20_4_ * fVar203;
  auVar58._24_4_ = auVar67._24_4_ * fVar204;
  auVar58._28_4_ = auVar56._28_4_;
  auVar45 = vfmadd231ps_fma(auVar69,auVar68,auVar57);
  auVar44 = vfmadd231ps_fma(auVar54,auVar68,auVar75);
  auVar43 = vfmadd231ps_fma(auVar58,auVar68,auVar66);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar221,auVar59);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar221,auVar74);
  auVar78._8_4_ = 0x7fffffff;
  auVar78._0_8_ = 0x7fffffff7fffffff;
  auVar78._12_4_ = 0x7fffffff;
  auVar78._16_4_ = 0x7fffffff;
  auVar78._20_4_ = 0x7fffffff;
  auVar78._24_4_ = 0x7fffffff;
  auVar78._28_4_ = 0x7fffffff;
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar221,auVar65);
  auVar59 = vandps_avx(ZEXT1632(auVar36),auVar78);
  auVar138._8_4_ = 0x219392ef;
  auVar138._0_8_ = 0x219392ef219392ef;
  auVar138._12_4_ = 0x219392ef;
  auVar138._16_4_ = 0x219392ef;
  auVar138._20_4_ = 0x219392ef;
  auVar138._24_4_ = 0x219392ef;
  auVar138._28_4_ = 0x219392ef;
  uVar30 = vcmpps_avx512vl(auVar59,auVar138,1);
  bVar34 = (bool)((byte)uVar30 & 1);
  auVar55._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._0_4_;
  bVar34 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._4_4_;
  bVar34 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._8_4_;
  bVar34 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar55._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._12_4_;
  auVar55._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * 0x219392ef;
  auVar55._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * 0x219392ef;
  auVar55._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * 0x219392ef;
  auVar55._28_4_ = (uint)(byte)(uVar30 >> 7) * 0x219392ef;
  auVar59 = vandps_avx(ZEXT1632(auVar47),auVar78);
  uVar30 = vcmpps_avx512vl(auVar59,auVar138,1);
  bVar34 = (bool)((byte)uVar30 & 1);
  auVar71._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._0_4_;
  bVar34 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._4_4_;
  bVar34 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._8_4_;
  bVar34 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar30 >> 7) * 0x219392ef;
  auVar59 = vandps_avx(ZEXT1632(auVar46),auVar78);
  uVar30 = vcmpps_avx512vl(auVar59,auVar138,1);
  bVar34 = (bool)((byte)uVar30 & 1);
  auVar59._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._0_4_;
  bVar34 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._4_4_;
  bVar34 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._8_4_;
  bVar34 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._12_4_;
  auVar59._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * 0x219392ef;
  auVar59._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * 0x219392ef;
  auVar59._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * 0x219392ef;
  auVar59._28_4_ = (uint)(byte)(uVar30 >> 7) * 0x219392ef;
  auVar57 = vrcp14ps_avx512vl(auVar55);
  auVar124._8_4_ = 0x3f800000;
  auVar124._0_8_ = 0x3f8000003f800000;
  auVar124._12_4_ = 0x3f800000;
  auVar124._16_4_ = 0x3f800000;
  auVar124._20_4_ = 0x3f800000;
  auVar124._24_4_ = 0x3f800000;
  auVar124._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar55,auVar57,auVar124);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar71);
  auVar47 = vfnmadd213ps_fma(auVar71,auVar57,auVar124);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar59);
  auVar46 = vfnmadd213ps_fma(auVar59,auVar57,auVar124);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar57,auVar57);
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 7 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar45));
  auVar65._4_4_ = auVar36._4_4_ * auVar59._4_4_;
  auVar65._0_4_ = auVar36._0_4_ * auVar59._0_4_;
  auVar65._8_4_ = auVar36._8_4_ * auVar59._8_4_;
  auVar65._12_4_ = auVar36._12_4_ * auVar59._12_4_;
  auVar65._16_4_ = auVar59._16_4_ * 0.0;
  auVar65._20_4_ = auVar59._20_4_ * 0.0;
  auVar65._24_4_ = auVar59._24_4_ * 0.0;
  auVar65._28_4_ = auVar59._28_4_;
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 9 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar45));
  auVar58 = vpbroadcastd_avx512vl();
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar77._0_4_ = auVar36._0_4_ * auVar59._0_4_;
  auVar77._4_4_ = auVar36._4_4_ * auVar59._4_4_;
  auVar77._8_4_ = auVar36._8_4_ * auVar59._8_4_;
  auVar77._12_4_ = auVar36._12_4_ * auVar59._12_4_;
  auVar77._16_4_ = auVar59._16_4_ * 0.0;
  auVar77._20_4_ = auVar59._20_4_ * 0.0;
  auVar77._24_4_ = auVar59._24_4_ * 0.0;
  auVar77._28_4_ = 0;
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar31 * -2 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar44));
  auVar66._4_4_ = auVar47._4_4_ * auVar59._4_4_;
  auVar66._0_4_ = auVar47._0_4_ * auVar59._0_4_;
  auVar66._8_4_ = auVar47._8_4_ * auVar59._8_4_;
  auVar66._12_4_ = auVar47._12_4_ * auVar59._12_4_;
  auVar66._16_4_ = auVar59._16_4_ * 0.0;
  auVar66._20_4_ = auVar59._20_4_ * 0.0;
  auVar66._24_4_ = auVar59._24_4_ * 0.0;
  auVar66._28_4_ = auVar59._28_4_;
  auVar59 = vcvtdq2ps_avx(auVar57);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar44));
  auVar76._0_4_ = auVar47._0_4_ * auVar59._0_4_;
  auVar76._4_4_ = auVar47._4_4_ * auVar59._4_4_;
  auVar76._8_4_ = auVar47._8_4_ * auVar59._8_4_;
  auVar76._12_4_ = auVar47._12_4_ * auVar59._12_4_;
  auVar76._16_4_ = auVar59._16_4_ * 0.0;
  auVar76._20_4_ = auVar59._20_4_ * 0.0;
  auVar76._24_4_ = auVar59._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 + uVar31 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar43));
  auVar67._4_4_ = auVar59._4_4_ * auVar46._4_4_;
  auVar67._0_4_ = auVar59._0_4_ * auVar46._0_4_;
  auVar67._8_4_ = auVar59._8_4_ * auVar46._8_4_;
  auVar67._12_4_ = auVar59._12_4_ * auVar46._12_4_;
  auVar67._16_4_ = auVar59._16_4_ * 0.0;
  auVar67._20_4_ = auVar59._20_4_ * 0.0;
  auVar67._24_4_ = auVar59._24_4_ * 0.0;
  auVar67._28_4_ = auVar59._28_4_;
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x17 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar43));
  auVar73._0_4_ = auVar46._0_4_ * auVar59._0_4_;
  auVar73._4_4_ = auVar46._4_4_ * auVar59._4_4_;
  auVar73._8_4_ = auVar46._8_4_ * auVar59._8_4_;
  auVar73._12_4_ = auVar46._12_4_ * auVar59._12_4_;
  auVar73._16_4_ = auVar59._16_4_ * 0.0;
  auVar73._20_4_ = auVar59._20_4_ * 0.0;
  auVar73._24_4_ = auVar59._24_4_ * 0.0;
  auVar73._28_4_ = 0;
  auVar59 = vpminsd_avx2(auVar65,auVar77);
  auVar57 = vpminsd_avx2(auVar66,auVar76);
  auVar59 = vmaxps_avx(auVar59,auVar57);
  auVar57 = vpminsd_avx2(auVar67,auVar73);
  uVar91 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar64._4_4_ = uVar91;
  auVar64._0_4_ = uVar91;
  auVar64._8_4_ = uVar91;
  auVar64._12_4_ = uVar91;
  auVar64._16_4_ = uVar91;
  auVar64._20_4_ = uVar91;
  auVar64._24_4_ = uVar91;
  auVar64._28_4_ = uVar91;
  auVar57 = vmaxps_avx512vl(auVar57,auVar64);
  auVar59 = vmaxps_avx(auVar59,auVar57);
  auVar57._8_4_ = 0x3f7ffffa;
  auVar57._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar57._12_4_ = 0x3f7ffffa;
  auVar57._16_4_ = 0x3f7ffffa;
  auVar57._20_4_ = 0x3f7ffffa;
  auVar57._24_4_ = 0x3f7ffffa;
  auVar57._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar59,auVar57);
  auVar59 = vpmaxsd_avx2(auVar65,auVar77);
  auVar57 = vpmaxsd_avx2(auVar66,auVar76);
  auVar59 = vminps_avx(auVar59,auVar57);
  auVar57 = vpmaxsd_avx2(auVar67,auVar73);
  fVar205 = (ray->super_RayK<1>).tfar;
  auVar74._4_4_ = fVar205;
  auVar74._0_4_ = fVar205;
  auVar74._8_4_ = fVar205;
  auVar74._12_4_ = fVar205;
  auVar74._16_4_ = fVar205;
  auVar74._20_4_ = fVar205;
  auVar74._24_4_ = fVar205;
  auVar74._28_4_ = fVar205;
  auVar57 = vminps_avx512vl(auVar57,auVar74);
  auVar59 = vminps_avx(auVar59,auVar57);
  auVar75._8_4_ = 0x3f800003;
  auVar75._0_8_ = 0x3f8000033f800003;
  auVar75._12_4_ = 0x3f800003;
  auVar75._16_4_ = 0x3f800003;
  auVar75._20_4_ = 0x3f800003;
  auVar75._24_4_ = 0x3f800003;
  auVar75._28_4_ = 0x3f800003;
  auVar59 = vmulps_avx512vl(auVar59,auVar75);
  uVar11 = vpcmpgtd_avx512vl(auVar58,_DAT_01fe9900);
  uVar10 = vcmpps_avx512vl(local_78,auVar59,2);
  if ((byte)((byte)uVar10 & (byte)uVar11) != 0) {
    uVar30 = (ulong)(byte)((byte)uVar10 & (byte)uVar11);
    auVar72._16_16_ = auVar59._16_16_;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar233 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar234 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar235 = ZEXT1664(auVar36);
    auVar243 = ZEXT464(0x3f800000);
    do {
      lVar26 = 0;
      for (uVar24 = uVar30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar29 = *(uint *)(prim + 2);
      pGVar6 = (context->scene->geometries).items[uVar29].ptr;
      local_2f0 = (ulong)*(uint *)(prim + lVar26 * 4 + 6);
      uVar24 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar26 * 4 + 6));
      p_Var7 = pGVar6[1].intersectionFilterN;
      pvVar8 = pGVar6[2].userPtr;
      _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar36 = *(undefined1 (*) [16])(_Var9 + uVar24 * (long)pvVar8);
      auVar47 = *(undefined1 (*) [16])(_Var9 + (uVar24 + 1) * (long)pvVar8);
      auVar46 = *(undefined1 (*) [16])(_Var9 + (uVar24 + 2) * (long)pvVar8);
      auVar45 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar24 + 3));
      lVar26 = *(long *)&pGVar6[1].time_range.upper;
      auVar44 = *(undefined1 (*) [16])(lVar26 + (long)p_Var7 * uVar24);
      auVar43 = *(undefined1 (*) [16])(lVar26 + (long)p_Var7 * (uVar24 + 1));
      auVar42 = *(undefined1 (*) [16])(lVar26 + (long)p_Var7 * (uVar24 + 2));
      uVar30 = uVar30 - 1 & uVar30;
      auVar41 = *(undefined1 (*) [16])(lVar26 + (long)p_Var7 * (uVar24 + 3));
      if (uVar30 != 0) {
        uVar31 = uVar30 - 1 & uVar30;
        for (uVar24 = uVar30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        }
        if (uVar31 != 0) {
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar61._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar37 = vmulps_avx512vl(auVar41,auVar61._0_16_);
      auVar222._8_4_ = 0x3e2aaaab;
      auVar222._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar222._12_4_ = 0x3e2aaaab;
      auVar38 = vfmadd213ps_fma(auVar222,auVar42,auVar37);
      auVar216._8_4_ = 0x3f2aaaab;
      auVar216._0_8_ = 0x3f2aaaab3f2aaaab;
      auVar216._12_4_ = 0x3f2aaaab;
      auVar38 = vfmadd231ps_fma(auVar38,auVar43,auVar216);
      auVar51 = vfmadd231ps_fma(auVar38,auVar44,auVar222);
      auVar52 = auVar233._0_16_;
      auVar38 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar52);
      auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar43,auVar61._0_16_);
      auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar44,auVar52);
      auVar37 = vmulps_avx512vl(auVar45,auVar61._0_16_);
      auVar38 = vfmadd213ps_fma(auVar222,auVar46,auVar37);
      auVar38 = vfmadd231ps_fma(auVar38,auVar47,auVar216);
      auVar38 = vfmadd231ps_fma(auVar38,auVar36,auVar222);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar46,auVar52);
      auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar47,auVar61._0_16_);
      auVar40 = vfnmadd231ps_avx512vl(auVar37,auVar36,auVar52);
      auVar99._0_4_ = auVar41._0_4_ * 0.16666667;
      auVar99._4_4_ = auVar41._4_4_ * 0.16666667;
      auVar99._8_4_ = auVar41._8_4_ * 0.16666667;
      auVar99._12_4_ = auVar41._12_4_ * 0.16666667;
      auVar37 = vfmadd231ps_fma(auVar99,auVar42,auVar216);
      auVar37 = vfmadd231ps_fma(auVar37,auVar43,auVar222);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar44,auVar61._0_16_);
      auVar41 = vmulps_avx512vl(auVar41,auVar52);
      auVar42 = vfmadd231ps_avx512vl(auVar41,auVar61._0_16_,auVar42);
      auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar52,auVar43);
      auVar42 = vfnmadd231ps_avx512vl(auVar43,auVar61._0_16_,auVar44);
      auVar158._0_4_ = auVar45._0_4_ * 0.16666667;
      auVar158._4_4_ = auVar45._4_4_ * 0.16666667;
      auVar158._8_4_ = auVar45._8_4_ * 0.16666667;
      auVar158._12_4_ = auVar45._12_4_ * 0.16666667;
      auVar44 = vfmadd231ps_fma(auVar158,auVar46,auVar216);
      auVar44 = vfmadd231ps_fma(auVar44,auVar47,auVar222);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar36,auVar61._0_16_);
      auVar45 = vmulps_avx512vl(auVar45,auVar52);
      auVar46 = vfmadd231ps_avx512vl(auVar45,auVar61._0_16_,auVar46);
      auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar52,auVar47);
      auVar43 = vfnmadd231ps_avx512vl(auVar47,auVar61._0_16_,auVar36);
      auVar36 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar47 = vshufps_avx(auVar38,auVar38,0xc9);
      fVar202 = auVar39._0_4_;
      auVar126._0_4_ = fVar202 * auVar47._0_4_;
      fVar203 = auVar39._4_4_;
      auVar126._4_4_ = fVar203 * auVar47._4_4_;
      fVar204 = auVar39._8_4_;
      auVar126._8_4_ = fVar204 * auVar47._8_4_;
      fVar96 = auVar39._12_4_;
      auVar126._12_4_ = fVar96 * auVar47._12_4_;
      auVar47 = vfmsub231ps_fma(auVar126,auVar36,auVar38);
      auVar46 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar127._0_4_ = fVar202 * auVar47._0_4_;
      auVar127._4_4_ = fVar203 * auVar47._4_4_;
      auVar127._8_4_ = fVar204 * auVar47._8_4_;
      auVar127._12_4_ = fVar96 * auVar47._12_4_;
      auVar36 = vfmsub231ps_fma(auVar127,auVar36,auVar40);
      auVar45 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar36 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar47 = vshufps_avx(auVar44,auVar44,0xc9);
      fVar108 = auVar42._0_4_;
      auVar118._0_4_ = fVar108 * auVar47._0_4_;
      fVar115 = auVar42._4_4_;
      auVar118._4_4_ = fVar115 * auVar47._4_4_;
      fVar116 = auVar42._8_4_;
      auVar118._8_4_ = fVar116 * auVar47._8_4_;
      fVar117 = auVar42._12_4_;
      auVar118._12_4_ = fVar117 * auVar47._12_4_;
      auVar47 = vfmsub231ps_fma(auVar118,auVar36,auVar44);
      auVar44 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar159._0_4_ = auVar47._0_4_ * fVar108;
      auVar159._4_4_ = auVar47._4_4_ * fVar115;
      auVar159._8_4_ = auVar47._8_4_ * fVar116;
      auVar159._12_4_ = auVar47._12_4_ * fVar117;
      auVar47 = vfmsub231ps_fma(auVar159,auVar36,auVar43);
      auVar36 = vdpps_avx(auVar46,auVar46,0x7f);
      auVar43 = vshufps_avx(auVar47,auVar47,0xc9);
      fVar90 = auVar36._0_4_;
      auVar61._16_16_ = auVar72._16_16_;
      auVar60._4_28_ = auVar61._4_28_;
      auVar60._0_4_ = fVar90;
      auVar47 = vrsqrt14ss_avx512f(auVar61._0_16_,auVar60._0_16_);
      fVar205 = auVar47._0_4_;
      auVar47 = vdpps_avx(auVar46,auVar45,0x7f);
      fVar205 = fVar205 * 1.5 + fVar90 * -0.5 * fVar205 * fVar205 * fVar205;
      fVar186 = fVar205 * auVar46._0_4_;
      fVar197 = fVar205 * auVar46._4_4_;
      fVar199 = fVar205 * auVar46._8_4_;
      fVar201 = fVar205 * auVar46._12_4_;
      auVar167._0_4_ = auVar45._0_4_ * fVar90;
      auVar167._4_4_ = auVar45._4_4_ * fVar90;
      auVar167._8_4_ = auVar45._8_4_ * fVar90;
      auVar167._12_4_ = auVar45._12_4_ * fVar90;
      fVar90 = auVar47._0_4_;
      auVar141._0_4_ = fVar90 * auVar46._0_4_;
      auVar141._4_4_ = fVar90 * auVar46._4_4_;
      auVar141._8_4_ = fVar90 * auVar46._8_4_;
      auVar141._12_4_ = fVar90 * auVar46._12_4_;
      auVar46 = vsubps_avx(auVar167,auVar141);
      auVar47 = vrcp14ss_avx512f(auVar61._0_16_,auVar60._0_16_);
      auVar36 = vfnmadd213ss_avx512f(auVar36,auVar47,ZEXT416(0x40000000));
      fVar198 = auVar47._0_4_ * auVar36._0_4_;
      auVar36 = vdpps_avx(auVar44,auVar44,0x7f);
      fVar200 = auVar36._0_4_;
      auVar63._16_16_ = auVar72._16_16_;
      auVar63._0_16_ = auVar61._0_16_;
      auVar62._4_28_ = auVar63._4_28_;
      auVar62._0_4_ = fVar200;
      auVar47 = vrsqrt14ss_avx512f(auVar61._0_16_,auVar62._0_16_);
      fVar90 = auVar47._0_4_;
      fVar90 = fVar90 * 1.5 + fVar200 * -0.5 * fVar90 * fVar90 * fVar90;
      auVar47 = vdpps_avx(auVar44,auVar43,0x7f);
      fVar206 = fVar90 * auVar44._0_4_;
      fVar213 = fVar90 * auVar44._4_4_;
      fVar214 = fVar90 * auVar44._8_4_;
      fVar215 = fVar90 * auVar44._12_4_;
      auVar128._0_4_ = fVar200 * auVar43._0_4_;
      auVar128._4_4_ = fVar200 * auVar43._4_4_;
      auVar128._8_4_ = fVar200 * auVar43._8_4_;
      auVar128._12_4_ = fVar200 * auVar43._12_4_;
      fVar200 = auVar47._0_4_;
      auVar119._0_4_ = fVar200 * auVar44._0_4_;
      auVar119._4_4_ = fVar200 * auVar44._4_4_;
      auVar119._8_4_ = fVar200 * auVar44._8_4_;
      auVar119._12_4_ = fVar200 * auVar44._12_4_;
      auVar45 = vsubps_avx(auVar128,auVar119);
      auVar47 = vrcp14ss_avx512f(auVar61._0_16_,auVar62._0_16_);
      auVar36 = vfnmadd213ss_avx512f(auVar36,auVar47,ZEXT416(0x40000000));
      fVar200 = auVar47._0_4_ * auVar36._0_4_;
      auVar36 = vshufps_avx(auVar51,auVar51,0xff);
      auVar148._0_4_ = fVar186 * auVar36._0_4_;
      auVar148._4_4_ = fVar197 * auVar36._4_4_;
      auVar148._8_4_ = fVar199 * auVar36._8_4_;
      auVar148._12_4_ = fVar201 * auVar36._12_4_;
      local_1d8 = vsubps_avx(auVar51,auVar148);
      auVar47 = vshufps_avx(auVar39,auVar39,0xff);
      auVar129._0_4_ = auVar47._0_4_ * fVar186 + auVar36._0_4_ * fVar205 * auVar46._0_4_ * fVar198;
      auVar129._4_4_ = auVar47._4_4_ * fVar197 + auVar36._4_4_ * fVar205 * auVar46._4_4_ * fVar198;
      auVar129._8_4_ = auVar47._8_4_ * fVar199 + auVar36._8_4_ * fVar205 * auVar46._8_4_ * fVar198;
      auVar129._12_4_ =
           auVar47._12_4_ * fVar201 + auVar36._12_4_ * fVar205 * auVar46._12_4_ * fVar198;
      auVar46 = vsubps_avx(auVar39,auVar129);
      local_1e8._0_4_ = auVar51._0_4_ + auVar148._0_4_;
      local_1e8._4_4_ = auVar51._4_4_ + auVar148._4_4_;
      fStack_1e0 = auVar51._8_4_ + auVar148._8_4_;
      fStack_1dc = auVar51._12_4_ + auVar148._12_4_;
      auVar36 = vshufps_avx(auVar37,auVar37,0xff);
      auVar130._0_4_ = fVar206 * auVar36._0_4_;
      auVar130._4_4_ = fVar213 * auVar36._4_4_;
      auVar130._8_4_ = fVar214 * auVar36._8_4_;
      auVar130._12_4_ = fVar215 * auVar36._12_4_;
      local_1f8 = vsubps_avx(auVar37,auVar130);
      auVar47 = vshufps_avx(auVar42,auVar42,0xff);
      auVar52._0_4_ = fVar206 * auVar47._0_4_ + auVar36._0_4_ * fVar90 * auVar45._0_4_ * fVar200;
      auVar52._4_4_ = fVar213 * auVar47._4_4_ + auVar36._4_4_ * fVar90 * auVar45._4_4_ * fVar200;
      auVar52._8_4_ = fVar214 * auVar47._8_4_ + auVar36._8_4_ * fVar90 * auVar45._8_4_ * fVar200;
      auVar52._12_4_ = fVar215 * auVar47._12_4_ + auVar36._12_4_ * fVar90 * auVar45._12_4_ * fVar200
      ;
      auVar36 = vsubps_avx(auVar42,auVar52);
      _local_208 = vaddps_avx512vl(auVar37,auVar130);
      auVar48._0_4_ = auVar46._0_4_ * 0.33333334;
      auVar48._4_4_ = auVar46._4_4_ * 0.33333334;
      auVar48._8_4_ = auVar46._8_4_ * 0.33333334;
      auVar48._12_4_ = auVar46._12_4_ * 0.33333334;
      local_218 = vaddps_avx512vl(local_1d8,auVar48);
      auVar49._0_4_ = auVar36._0_4_ * 0.33333334;
      auVar49._4_4_ = auVar36._4_4_ * 0.33333334;
      auVar49._8_4_ = auVar36._8_4_ * 0.33333334;
      auVar49._12_4_ = auVar36._12_4_ * 0.33333334;
      local_228 = vsubps_avx512vl(local_1f8,auVar49);
      auVar37._0_4_ = (fVar202 + auVar129._0_4_) * 0.33333334;
      auVar37._4_4_ = (fVar203 + auVar129._4_4_) * 0.33333334;
      auVar37._8_4_ = (fVar204 + auVar129._8_4_) * 0.33333334;
      auVar37._12_4_ = (fVar96 + auVar129._12_4_) * 0.33333334;
      _local_238 = vaddps_avx512vl(_local_1e8,auVar37);
      auVar39._0_4_ = (fVar108 + auVar52._0_4_) * 0.33333334;
      auVar39._4_4_ = (fVar115 + auVar52._4_4_) * 0.33333334;
      auVar39._8_4_ = (fVar116 + auVar52._8_4_) * 0.33333334;
      auVar39._12_4_ = (fVar117 + auVar52._12_4_) * 0.33333334;
      aVar1 = (ray->super_RayK<1>).org.field_0;
      _local_248 = vsubps_avx512vl(_local_208,auVar39);
      auVar47 = vsubps_avx(local_1d8,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar50._4_4_ = uVar91;
      auVar50._0_4_ = uVar91;
      auVar50._8_4_ = uVar91;
      auVar50._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      aVar2 = (pre->ray_space).vx.field_0;
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      aVar3 = (pre->ray_space).vy.field_0;
      fVar205 = (pre->ray_space).vz.field_0.m128[0];
      fVar90 = (pre->ray_space).vz.field_0.m128[1];
      fVar198 = (pre->ray_space).vz.field_0.m128[2];
      fVar200 = (pre->ray_space).vz.field_0.m128[3];
      auVar40._0_4_ = fVar205 * auVar47._0_4_;
      auVar40._4_4_ = fVar90 * auVar47._4_4_;
      auVar40._8_4_ = fVar198 * auVar47._8_4_;
      auVar40._12_4_ = fVar200 * auVar47._12_4_;
      auVar36 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar36);
      auVar44 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar50);
      auVar47 = vsubps_avx512vl(local_218,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar53._4_4_ = uVar91;
      auVar53._0_4_ = uVar91;
      auVar53._8_4_ = uVar91;
      auVar53._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar97._0_4_ = fVar205 * auVar47._0_4_;
      auVar97._4_4_ = fVar90 * auVar47._4_4_;
      auVar97._8_4_ = fVar198 * auVar47._8_4_;
      auVar97._12_4_ = fVar200 * auVar47._12_4_;
      auVar36 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar3,auVar36);
      auVar43 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar53);
      auVar47 = vsubps_avx512vl(local_228,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar149._4_4_ = uVar91;
      auVar149._0_4_ = uVar91;
      auVar149._8_4_ = uVar91;
      auVar149._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar100._0_4_ = fVar205 * auVar47._0_4_;
      auVar100._4_4_ = fVar90 * auVar47._4_4_;
      auVar100._8_4_ = fVar198 * auVar47._8_4_;
      auVar100._12_4_ = fVar200 * auVar47._12_4_;
      auVar36 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar3,auVar36);
      auVar42 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar149);
      auVar47 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar160._4_4_ = uVar91;
      auVar160._0_4_ = uVar91;
      auVar160._8_4_ = uVar91;
      auVar160._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar150._0_4_ = fVar205 * auVar47._0_4_;
      auVar150._4_4_ = fVar90 * auVar47._4_4_;
      auVar150._8_4_ = fVar198 * auVar47._8_4_;
      auVar150._12_4_ = fVar200 * auVar47._12_4_;
      auVar36 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar36);
      auVar41 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar160);
      auVar47 = vsubps_avx(_local_1e8,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar168._4_4_ = uVar91;
      auVar168._0_4_ = uVar91;
      auVar168._8_4_ = uVar91;
      auVar168._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar161._0_4_ = auVar47._0_4_ * fVar205;
      auVar161._4_4_ = auVar47._4_4_ * fVar90;
      auVar161._8_4_ = auVar47._8_4_ * fVar198;
      auVar161._12_4_ = auVar47._12_4_ * fVar200;
      auVar36 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar3,auVar36);
      auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar168);
      auVar47 = vsubps_avx512vl(_local_238,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar179._4_4_ = uVar91;
      auVar179._0_4_ = uVar91;
      auVar179._8_4_ = uVar91;
      auVar179._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar169._0_4_ = auVar47._0_4_ * fVar205;
      auVar169._4_4_ = auVar47._4_4_ * fVar90;
      auVar169._8_4_ = auVar47._8_4_ * fVar198;
      auVar169._12_4_ = auVar47._12_4_ * fVar200;
      auVar36 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar3,auVar36);
      auVar72._16_16_ = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar179);
      auVar47 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar187._4_4_ = uVar91;
      auVar187._0_4_ = uVar91;
      auVar187._8_4_ = uVar91;
      auVar187._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar180._0_4_ = auVar47._0_4_ * fVar205;
      auVar180._4_4_ = auVar47._4_4_ * fVar90;
      auVar180._8_4_ = auVar47._8_4_ * fVar198;
      auVar180._12_4_ = auVar47._12_4_ * fVar200;
      auVar36 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar36);
      auVar51 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar187);
      auVar47 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
      uVar91 = auVar47._0_4_;
      auVar188._4_4_ = uVar91;
      auVar188._0_4_ = uVar91;
      auVar188._8_4_ = uVar91;
      auVar188._12_4_ = uVar91;
      auVar36 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar120._0_4_ = fVar205 * auVar47._0_4_;
      auVar120._4_4_ = fVar90 * auVar47._4_4_;
      auVar120._8_4_ = fVar198 * auVar47._8_4_;
      auVar120._12_4_ = fVar200 * auVar47._12_4_;
      auVar36 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar3,auVar36);
      auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar188);
      local_288 = vmovlhps_avx(auVar44,auVar38);
      local_198 = vmovlhps_avx512f(auVar43,auVar72._16_16_);
      local_1a8 = vmovlhps_avx512f(auVar42,auVar51);
      _local_f8 = vmovlhps_avx512f(auVar41,auVar37);
      auVar36 = vminps_avx512vl(local_288,local_198);
      auVar46 = vmaxps_avx512vl(local_288,local_198);
      auVar47 = vminps_avx512vl(local_1a8,_local_f8);
      auVar47 = vminps_avx(auVar36,auVar47);
      auVar36 = vmaxps_avx512vl(local_1a8,_local_f8);
      auVar36 = vmaxps_avx(auVar46,auVar36);
      auVar46 = vshufpd_avx(auVar47,auVar47,3);
      auVar45 = vshufpd_avx(auVar36,auVar36,3);
      auVar47 = vminps_avx(auVar47,auVar46);
      auVar36 = vmaxps_avx(auVar36,auVar45);
      auVar47 = vandps_avx512vl(auVar47,auVar234._0_16_);
      auVar36 = vandps_avx512vl(auVar36,auVar234._0_16_);
      auVar36 = vmaxps_avx(auVar47,auVar36);
      auVar47 = vmovshdup_avx(auVar36);
      auVar36 = vmaxss_avx(auVar47,auVar36);
      local_1b8 = vmovddup_avx512vl(auVar44);
      auVar240 = ZEXT1664(local_1b8);
      local_1c8 = vmovddup_avx512vl(auVar43);
      auVar242 = ZEXT1664(local_1c8);
      local_298._8_8_ = auVar42._0_8_;
      local_298._0_8_ = auVar42._0_8_;
      local_2a8._0_8_ = auVar41._0_8_;
      local_2a8._8_8_ = local_2a8._0_8_;
      register0x00001348 = auVar38._0_8_;
      local_2b8 = auVar38._0_8_;
      register0x00001388 = auVar72._16_8_;
      local_2c8 = auVar72._16_8_;
      register0x00001408 = auVar51._0_8_;
      local_2d8 = auVar51._0_8_;
      register0x00001448 = auVar37._0_8_;
      local_2e8 = auVar37._0_8_;
      local_e8 = ZEXT416((uint)(auVar36._0_4_ * 9.536743e-07));
      local_b8 = vbroadcastss_avx512vl(local_e8);
      auVar36 = vxorps_avx512vl(local_b8._0_16_,auVar235._0_16_);
      local_d8 = vbroadcastss_avx512vl(auVar36);
      local_308 = vsubps_avx512vl(local_198,local_288);
      local_318 = vsubps_avx512vl(local_1a8,local_198);
      local_108 = vsubps_avx512vl(_local_f8,local_1a8);
      local_118 = vsubps_avx(_local_1e8,local_1d8);
      local_128 = vsubps_avx512vl(_local_238,local_218);
      local_138 = vsubps_avx512vl(_local_248,local_228);
      _local_148 = vsubps_avx512vl(_local_208,local_1f8);
      uVar24 = 0;
      auVar36 = ZEXT816(0x3f80000000000000);
      auVar51 = auVar36;
LAB_01cc4e05:
      auVar47 = vshufps_avx(auVar51,auVar51,0x50);
      auVar223._8_4_ = 0x3f800000;
      auVar223._0_8_ = 0x3f8000003f800000;
      auVar223._12_4_ = 0x3f800000;
      auVar226._16_4_ = 0x3f800000;
      auVar226._0_16_ = auVar223;
      auVar226._20_4_ = 0x3f800000;
      auVar226._24_4_ = 0x3f800000;
      auVar226._28_4_ = 0x3f800000;
      auVar46 = vsubps_avx(auVar223,auVar47);
      fVar205 = auVar47._0_4_;
      auVar121._0_4_ = local_2b8._0_4_ * fVar205;
      fVar90 = auVar47._4_4_;
      auVar121._4_4_ = local_2b8._4_4_ * fVar90;
      fVar198 = auVar47._8_4_;
      auVar121._8_4_ = local_2b8._8_4_ * fVar198;
      fVar200 = auVar47._12_4_;
      auVar121._12_4_ = local_2b8._12_4_ * fVar200;
      auVar131._0_4_ = local_2c8._0_4_ * fVar205;
      auVar131._4_4_ = local_2c8._4_4_ * fVar90;
      auVar131._8_4_ = local_2c8._8_4_ * fVar198;
      auVar131._12_4_ = local_2c8._12_4_ * fVar200;
      auVar142._0_4_ = local_2d8._0_4_ * fVar205;
      auVar142._4_4_ = local_2d8._4_4_ * fVar90;
      auVar142._8_4_ = local_2d8._8_4_ * fVar198;
      auVar142._12_4_ = local_2d8._12_4_ * fVar200;
      auVar101._0_4_ = local_2e8._0_4_ * fVar205;
      auVar101._4_4_ = local_2e8._4_4_ * fVar90;
      auVar101._8_4_ = local_2e8._8_4_ * fVar198;
      auVar101._12_4_ = local_2e8._12_4_ * fVar200;
      auVar44 = vfmadd231ps_avx512vl(auVar121,auVar46,auVar240._0_16_);
      auVar43 = vfmadd231ps_avx512vl(auVar131,auVar46,auVar242._0_16_);
      auVar45 = vfmadd231ps_fma(auVar142,auVar46,local_298);
      auVar46 = vfmadd231ps_fma(auVar101,local_2a8,auVar46);
      auVar47 = vmovshdup_avx(auVar36);
      fVar90 = auVar36._0_4_;
      fVar205 = (auVar47._0_4_ - fVar90) * 0.04761905;
      auVar166._4_4_ = fVar90;
      auVar166._0_4_ = fVar90;
      auVar166._8_4_ = fVar90;
      auVar166._12_4_ = fVar90;
      auVar166._16_4_ = fVar90;
      auVar166._20_4_ = fVar90;
      auVar166._24_4_ = fVar90;
      auVar166._28_4_ = fVar90;
      auVar113._0_8_ = auVar47._0_8_;
      auVar113._8_8_ = auVar113._0_8_;
      auVar113._16_8_ = auVar113._0_8_;
      auVar113._24_8_ = auVar113._0_8_;
      auVar59 = vsubps_avx(auVar113,auVar166);
      uVar91 = auVar44._0_4_;
      auVar114._4_4_ = uVar91;
      auVar114._0_4_ = uVar91;
      auVar114._8_4_ = uVar91;
      auVar114._12_4_ = uVar91;
      auVar114._16_4_ = uVar91;
      auVar114._20_4_ = uVar91;
      auVar114._24_4_ = uVar91;
      auVar114._28_4_ = uVar91;
      auVar183._8_4_ = 1;
      auVar183._0_8_ = 0x100000001;
      auVar183._12_4_ = 1;
      auVar183._16_4_ = 1;
      auVar183._20_4_ = 1;
      auVar183._24_4_ = 1;
      auVar183._28_4_ = 1;
      auVar74 = ZEXT1632(auVar44);
      auVar57 = vpermps_avx2(auVar183,auVar74);
      auVar64 = vbroadcastss_avx512vl(auVar43);
      auVar75 = ZEXT1632(auVar43);
      auVar58 = vpermps_avx512vl(auVar183,auVar75);
      auVar65 = vbroadcastss_avx512vl(auVar45);
      auVar72 = ZEXT1632(auVar45);
      auVar66 = vpermps_avx512vl(auVar183,auVar72);
      auVar67 = vbroadcastss_avx512vl(auVar46);
      auVar71 = ZEXT1632(auVar46);
      auVar68 = vpermps_avx512vl(auVar183,auVar71);
      auVar184._4_4_ = fVar205;
      auVar184._0_4_ = fVar205;
      auVar184._8_4_ = fVar205;
      auVar184._12_4_ = fVar205;
      auVar184._16_4_ = fVar205;
      auVar184._20_4_ = fVar205;
      auVar184._24_4_ = fVar205;
      auVar184._28_4_ = fVar205;
      auVar56 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar69 = vpermps_avx512vl(auVar56,auVar74);
      auVar157._8_4_ = 3;
      auVar157._0_8_ = 0x300000003;
      auVar157._12_4_ = 3;
      auVar157._16_4_ = 3;
      auVar157._20_4_ = 3;
      auVar157._24_4_ = 3;
      auVar157._28_4_ = 3;
      auVar70 = vpermps_avx512vl(auVar157,auVar74);
      auVar54 = vpermps_avx512vl(auVar56,auVar75);
      auVar74 = vpermps_avx2(auVar157,auVar75);
      auVar55 = vpermps_avx512vl(auVar56,auVar72);
      auVar75 = vpermps_avx2(auVar157,auVar72);
      auVar56 = vpermps_avx512vl(auVar56,auVar71);
      auVar71 = vpermps_avx512vl(auVar157,auVar71);
      auVar47 = vfmadd132ps_fma(auVar59,auVar166,_DAT_01faff20);
      auVar59 = vsubps_avx(auVar226,ZEXT1632(auVar47));
      auVar72 = vmulps_avx512vl(auVar64,ZEXT1632(auVar47));
      auVar76 = ZEXT1632(auVar47);
      auVar73 = vmulps_avx512vl(auVar58,auVar76);
      auVar46 = vfmadd231ps_fma(auVar72,auVar59,auVar114);
      auVar45 = vfmadd231ps_fma(auVar73,auVar59,auVar57);
      auVar72 = vmulps_avx512vl(auVar65,auVar76);
      auVar73 = vmulps_avx512vl(auVar66,auVar76);
      auVar64 = vfmadd231ps_avx512vl(auVar72,auVar59,auVar64);
      auVar58 = vfmadd231ps_avx512vl(auVar73,auVar59,auVar58);
      auVar72 = vmulps_avx512vl(auVar67,auVar76);
      auVar73 = ZEXT1632(auVar47);
      auVar68 = vmulps_avx512vl(auVar68,auVar73);
      auVar65 = vfmadd231ps_avx512vl(auVar72,auVar59,auVar65);
      auVar66 = vfmadd231ps_avx512vl(auVar68,auVar59,auVar66);
      fVar198 = auVar47._0_4_;
      fVar200 = auVar47._4_4_;
      auVar16._4_4_ = fVar200 * auVar64._4_4_;
      auVar16._0_4_ = fVar198 * auVar64._0_4_;
      fVar202 = auVar47._8_4_;
      auVar16._8_4_ = fVar202 * auVar64._8_4_;
      fVar203 = auVar47._12_4_;
      auVar16._12_4_ = fVar203 * auVar64._12_4_;
      auVar16._16_4_ = auVar64._16_4_ * 0.0;
      auVar16._20_4_ = auVar64._20_4_ * 0.0;
      auVar16._24_4_ = auVar64._24_4_ * 0.0;
      auVar16._28_4_ = fVar90;
      auVar17._4_4_ = fVar200 * auVar58._4_4_;
      auVar17._0_4_ = fVar198 * auVar58._0_4_;
      auVar17._8_4_ = fVar202 * auVar58._8_4_;
      auVar17._12_4_ = fVar203 * auVar58._12_4_;
      auVar17._16_4_ = auVar58._16_4_ * 0.0;
      auVar17._20_4_ = auVar58._20_4_ * 0.0;
      auVar17._24_4_ = auVar58._24_4_ * 0.0;
      auVar17._28_4_ = auVar57._28_4_;
      auVar46 = vfmadd231ps_fma(auVar16,auVar59,ZEXT1632(auVar46));
      auVar45 = vfmadd231ps_fma(auVar17,auVar59,ZEXT1632(auVar45));
      auVar106._0_4_ = fVar198 * auVar65._0_4_;
      auVar106._4_4_ = fVar200 * auVar65._4_4_;
      auVar106._8_4_ = fVar202 * auVar65._8_4_;
      auVar106._12_4_ = fVar203 * auVar65._12_4_;
      auVar106._16_4_ = auVar65._16_4_ * 0.0;
      auVar106._20_4_ = auVar65._20_4_ * 0.0;
      auVar106._24_4_ = auVar65._24_4_ * 0.0;
      auVar106._28_4_ = 0;
      auVar18._4_4_ = fVar200 * auVar66._4_4_;
      auVar18._0_4_ = fVar198 * auVar66._0_4_;
      auVar18._8_4_ = fVar202 * auVar66._8_4_;
      auVar18._12_4_ = fVar203 * auVar66._12_4_;
      auVar18._16_4_ = auVar66._16_4_ * 0.0;
      auVar18._20_4_ = auVar66._20_4_ * 0.0;
      auVar18._24_4_ = auVar66._24_4_ * 0.0;
      auVar18._28_4_ = auVar65._28_4_;
      auVar44 = vfmadd231ps_fma(auVar106,auVar59,auVar64);
      auVar43 = vfmadd231ps_fma(auVar18,auVar59,auVar58);
      auVar19._28_4_ = auVar58._28_4_;
      auVar19._0_28_ =
           ZEXT1628(CONCAT412(fVar203 * auVar43._12_4_,
                              CONCAT48(fVar202 * auVar43._8_4_,
                                       CONCAT44(fVar200 * auVar43._4_4_,fVar198 * auVar43._0_4_))));
      auVar42 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar203 * auVar44._12_4_,
                                                   CONCAT48(fVar202 * auVar44._8_4_,
                                                            CONCAT44(fVar200 * auVar44._4_4_,
                                                                     fVar198 * auVar44._0_4_)))),
                                auVar59,ZEXT1632(auVar46));
      auVar41 = vfmadd231ps_fma(auVar19,auVar59,ZEXT1632(auVar45));
      auVar57 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar46));
      auVar64 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar45));
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar57 = vmulps_avx512vl(auVar57,auVar58);
      auVar64 = vmulps_avx512vl(auVar64,auVar58);
      auVar178._0_4_ = fVar205 * auVar57._0_4_;
      auVar178._4_4_ = fVar205 * auVar57._4_4_;
      auVar178._8_4_ = fVar205 * auVar57._8_4_;
      auVar178._12_4_ = fVar205 * auVar57._12_4_;
      auVar178._16_4_ = fVar205 * auVar57._16_4_;
      auVar178._20_4_ = fVar205 * auVar57._20_4_;
      auVar178._24_4_ = fVar205 * auVar57._24_4_;
      auVar178._28_4_ = 0;
      auVar57 = vmulps_avx512vl(auVar184,auVar64);
      auVar45 = vxorps_avx512vl(auVar67._0_16_,auVar67._0_16_);
      auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar42),_DAT_01feed00,ZEXT1632(auVar45));
      auVar65 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01feed00,ZEXT1632(auVar45));
      auVar107._0_4_ = auVar178._0_4_ + auVar42._0_4_;
      auVar107._4_4_ = auVar178._4_4_ + auVar42._4_4_;
      auVar107._8_4_ = auVar178._8_4_ + auVar42._8_4_;
      auVar107._12_4_ = auVar178._12_4_ + auVar42._12_4_;
      auVar107._16_4_ = auVar178._16_4_ + 0.0;
      auVar107._20_4_ = auVar178._20_4_ + 0.0;
      auVar107._24_4_ = auVar178._24_4_ + 0.0;
      auVar107._28_4_ = 0;
      auVar76 = ZEXT1632(auVar45);
      auVar66 = vpermt2ps_avx512vl(auVar178,_DAT_01feed00,auVar76);
      auVar67 = vaddps_avx512vl(ZEXT1632(auVar41),auVar57);
      auVar68 = vpermt2ps_avx512vl(auVar57,_DAT_01feed00,auVar76);
      auVar57 = vsubps_avx(auVar64,auVar66);
      auVar66 = vsubps_avx512vl(auVar65,auVar68);
      auVar68 = vmulps_avx512vl(auVar54,auVar73);
      auVar72 = vmulps_avx512vl(auVar74,auVar73);
      auVar68 = vfmadd231ps_avx512vl(auVar68,auVar59,auVar69);
      auVar69 = vfmadd231ps_avx512vl(auVar72,auVar59,auVar70);
      auVar70 = vmulps_avx512vl(auVar55,auVar73);
      auVar72 = vmulps_avx512vl(auVar75,auVar73);
      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar59,auVar54);
      auVar74 = vfmadd231ps_avx512vl(auVar72,auVar59,auVar74);
      auVar56 = vmulps_avx512vl(auVar56,auVar73);
      auVar54 = vmulps_avx512vl(auVar71,auVar73);
      auVar46 = vfmadd231ps_fma(auVar56,auVar59,auVar55);
      auVar56 = vfmadd231ps_avx512vl(auVar54,auVar59,auVar75);
      auVar54 = vmulps_avx512vl(auVar73,auVar70);
      auVar71 = ZEXT1632(auVar47);
      auVar55 = vmulps_avx512vl(auVar71,auVar74);
      auVar68 = vfmadd231ps_avx512vl(auVar54,auVar59,auVar68);
      auVar69 = vfmadd231ps_avx512vl(auVar55,auVar59,auVar69);
      auVar56 = vmulps_avx512vl(auVar71,auVar56);
      auVar70 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar203 * auVar46._12_4_,
                                              CONCAT48(fVar202 * auVar46._8_4_,
                                                       CONCAT44(fVar200 * auVar46._4_4_,
                                                                fVar198 * auVar46._0_4_)))),auVar59,
                           auVar70);
      auVar74 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar74);
      auVar20._4_4_ = fVar200 * auVar70._4_4_;
      auVar20._0_4_ = fVar198 * auVar70._0_4_;
      auVar20._8_4_ = fVar202 * auVar70._8_4_;
      auVar20._12_4_ = fVar203 * auVar70._12_4_;
      auVar20._16_4_ = auVar70._16_4_ * 0.0;
      auVar20._20_4_ = auVar70._20_4_ * 0.0;
      auVar20._24_4_ = auVar70._24_4_ * 0.0;
      auVar20._28_4_ = auVar75._28_4_;
      auVar75 = vmulps_avx512vl(auVar71,auVar74);
      auVar56 = vfmadd231ps_avx512vl(auVar20,auVar59,auVar68);
      auVar75 = vfmadd231ps_avx512vl(auVar75,auVar69,auVar59);
      auVar59 = vsubps_avx512vl(auVar70,auVar68);
      auVar74 = vsubps_avx512vl(auVar74,auVar69);
      auVar59 = vmulps_avx512vl(auVar59,auVar58);
      auVar74 = vmulps_avx512vl(auVar74,auVar58);
      fVar90 = fVar205 * auVar59._0_4_;
      fVar198 = fVar205 * auVar59._4_4_;
      auVar21._4_4_ = fVar198;
      auVar21._0_4_ = fVar90;
      fVar200 = fVar205 * auVar59._8_4_;
      auVar21._8_4_ = fVar200;
      fVar202 = fVar205 * auVar59._12_4_;
      auVar21._12_4_ = fVar202;
      fVar203 = fVar205 * auVar59._16_4_;
      auVar21._16_4_ = fVar203;
      fVar204 = fVar205 * auVar59._20_4_;
      auVar21._20_4_ = fVar204;
      fVar205 = fVar205 * auVar59._24_4_;
      auVar21._24_4_ = fVar205;
      auVar21._28_4_ = auVar59._28_4_;
      auVar74 = vmulps_avx512vl(auVar184,auVar74);
      auVar58 = vpermt2ps_avx512vl(auVar56,_DAT_01feed00,auVar76);
      auVar68 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar76);
      auVar185._0_4_ = auVar56._0_4_ + fVar90;
      auVar185._4_4_ = auVar56._4_4_ + fVar198;
      auVar185._8_4_ = auVar56._8_4_ + fVar200;
      auVar185._12_4_ = auVar56._12_4_ + fVar202;
      auVar185._16_4_ = auVar56._16_4_ + fVar203;
      auVar185._20_4_ = auVar56._20_4_ + fVar204;
      auVar185._24_4_ = auVar56._24_4_ + fVar205;
      auVar185._28_4_ = auVar56._28_4_ + auVar59._28_4_;
      auVar59 = vpermt2ps_avx512vl(auVar21,_DAT_01feed00,ZEXT1632(auVar45));
      auVar69 = vaddps_avx512vl(auVar75,auVar74);
      auVar74 = vpermt2ps_avx512vl(auVar74,_DAT_01feed00,ZEXT1632(auVar45));
      auVar59 = vsubps_avx(auVar58,auVar59);
      auVar74 = vsubps_avx512vl(auVar68,auVar74);
      in_ZMM17 = ZEXT3264(auVar74);
      auVar124 = ZEXT1632(auVar42);
      auVar70 = vsubps_avx512vl(auVar56,auVar124);
      auVar138 = ZEXT1632(auVar41);
      auVar54 = vsubps_avx512vl(auVar75,auVar138);
      auVar55 = vsubps_avx512vl(auVar58,auVar64);
      auVar70 = vaddps_avx512vl(auVar70,auVar55);
      auVar55 = vsubps_avx512vl(auVar68,auVar65);
      auVar54 = vaddps_avx512vl(auVar54,auVar55);
      auVar55 = vmulps_avx512vl(auVar138,auVar70);
      auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar124,auVar54);
      auVar71 = vmulps_avx512vl(auVar67,auVar70);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar107,auVar54);
      auVar72 = vmulps_avx512vl(auVar66,auVar70);
      auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar57,auVar54);
      auVar73 = vmulps_avx512vl(auVar65,auVar70);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar64,auVar54);
      auVar76 = vmulps_avx512vl(auVar75,auVar70);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar56,auVar54);
      auVar77 = vmulps_avx512vl(auVar69,auVar70);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar185,auVar54);
      auVar78 = vmulps_avx512vl(auVar74,auVar70);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar59,auVar54);
      auVar70 = vmulps_avx512vl(auVar68,auVar70);
      auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar58,auVar54);
      auVar54 = vminps_avx512vl(auVar55,auVar71);
      auVar55 = vmaxps_avx512vl(auVar55,auVar71);
      auVar71 = vminps_avx512vl(auVar72,auVar73);
      auVar54 = vminps_avx512vl(auVar54,auVar71);
      auVar71 = vmaxps_avx512vl(auVar72,auVar73);
      auVar55 = vmaxps_avx512vl(auVar55,auVar71);
      auVar71 = vminps_avx512vl(auVar76,auVar77);
      auVar72 = vmaxps_avx512vl(auVar76,auVar77);
      auVar73 = vminps_avx512vl(auVar78,auVar70);
      auVar71 = vminps_avx512vl(auVar71,auVar73);
      auVar54 = vminps_avx512vl(auVar54,auVar71);
      auVar70 = vmaxps_avx512vl(auVar78,auVar70);
      auVar70 = vmaxps_avx512vl(auVar72,auVar70);
      auVar70 = vmaxps_avx512vl(auVar55,auVar70);
      uVar10 = vcmpps_avx512vl(auVar54,local_b8,2);
      uVar11 = vcmpps_avx512vl(auVar70,local_d8,5);
      bVar22 = (byte)uVar10 & (byte)uVar11 & 0x7f;
      if (bVar22 != 0) {
        auVar70 = vsubps_avx512vl(auVar64,auVar124);
        auVar54 = vsubps_avx512vl(auVar65,auVar138);
        auVar55 = vsubps_avx512vl(auVar58,auVar56);
        auVar70 = vaddps_avx512vl(auVar70,auVar55);
        auVar55 = vsubps_avx512vl(auVar68,auVar75);
        auVar54 = vaddps_avx512vl(auVar54,auVar55);
        auVar55 = vmulps_avx512vl(auVar138,auVar70);
        auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar54,auVar124);
        auVar67 = vmulps_avx512vl(auVar67,auVar70);
        auVar67 = vfnmadd213ps_avx512vl(auVar107,auVar54,auVar67);
        auVar66 = vmulps_avx512vl(auVar66,auVar70);
        auVar66 = vfnmadd213ps_avx512vl(auVar57,auVar54,auVar66);
        auVar57 = vmulps_avx512vl(auVar65,auVar70);
        auVar65 = vfnmadd231ps_avx512vl(auVar57,auVar54,auVar64);
        auVar57 = vmulps_avx512vl(auVar75,auVar70);
        auVar75 = vfnmadd231ps_avx512vl(auVar57,auVar54,auVar56);
        auVar57 = vmulps_avx512vl(auVar69,auVar70);
        auVar56 = vfnmadd213ps_avx512vl(auVar185,auVar54,auVar57);
        auVar57 = vmulps_avx512vl(auVar74,auVar70);
        auVar69 = vfnmadd213ps_avx512vl(auVar59,auVar54,auVar57);
        auVar59 = vmulps_avx512vl(auVar68,auVar70);
        auVar58 = vfnmadd231ps_avx512vl(auVar59,auVar58,auVar54);
        auVar57 = vminps_avx(auVar55,auVar67);
        auVar59 = vmaxps_avx(auVar55,auVar67);
        auVar64 = vminps_avx(auVar66,auVar65);
        auVar64 = vminps_avx(auVar57,auVar64);
        auVar57 = vmaxps_avx(auVar66,auVar65);
        auVar59 = vmaxps_avx(auVar59,auVar57);
        auVar74 = vminps_avx(auVar75,auVar56);
        auVar57 = vmaxps_avx(auVar75,auVar56);
        auVar75 = vminps_avx(auVar69,auVar58);
        auVar74 = vminps_avx(auVar74,auVar75);
        auVar74 = vminps_avx(auVar64,auVar74);
        auVar64 = vmaxps_avx(auVar69,auVar58);
        auVar57 = vmaxps_avx(auVar57,auVar64);
        auVar59 = vmaxps_avx(auVar59,auVar57);
        uVar10 = vcmpps_avx512vl(auVar59,local_d8,5);
        uVar11 = vcmpps_avx512vl(auVar74,local_b8,2);
        bVar22 = bVar22 & (byte)uVar10 & (byte)uVar11;
        if (bVar22 != 0) {
          auStack_188[uVar24] = (uint)bVar22;
          uVar10 = vmovlps_avx(auVar36);
          (&uStack_98)[uVar24] = uVar10;
          uVar31 = vmovlps_avx(auVar51);
          auStack_58[uVar24] = uVar31;
          uVar24 = (ulong)((int)uVar24 + 1);
        }
      }
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar233 = ZEXT1664(auVar36);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar234 = ZEXT1664(auVar36);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar235 = ZEXT1664(auVar36);
      auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar236 = ZEXT3264(auVar59);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar237 = ZEXT1664(auVar36);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar238 = ZEXT1664(auVar36);
      auVar239 = ZEXT3264(_DAT_01feed20);
      auVar72._16_16_ = DAT_01feed20._16_16_;
      auVar241 = ZEXT1664(local_308);
      auVar244 = ZEXT1664(local_318);
      if ((int)uVar24 != 0) {
        do {
          auVar46 = auVar242._0_16_;
          auVar47 = auVar240._0_16_;
          uVar23 = (int)uVar24 - 1;
          uVar25 = (ulong)uVar23;
          uVar5 = auStack_188[uVar25];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = auStack_58[uVar25];
          uVar31 = 0;
          for (uVar28 = (ulong)uVar5; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
          {
            uVar31 = uVar31 + 1;
          }
          uVar27 = uVar5 - 1 & uVar5;
          bVar34 = uVar27 == 0;
          auStack_188[uVar25] = uVar27;
          if (bVar34) {
            uVar24 = (ulong)uVar23;
          }
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar31;
          auVar36 = vpunpcklqdq_avx(auVar92,ZEXT416((int)uVar31 + 1));
          auVar36 = vcvtqq2ps_avx512vl(auVar36);
          auVar36 = vmulps_avx512vl(auVar36,auVar237._0_16_);
          uVar91 = *(undefined4 *)((long)&uStack_98 + uVar25 * 8 + 4);
          auVar12._4_4_ = uVar91;
          auVar12._0_4_ = uVar91;
          auVar12._8_4_ = uVar91;
          auVar12._12_4_ = uVar91;
          auVar45 = vmulps_avx512vl(auVar36,auVar12);
          auVar44 = auVar238._0_16_;
          auVar36 = vsubps_avx512vl(auVar44,auVar36);
          uVar91 = *(undefined4 *)(&uStack_98 + uVar25);
          auVar13._4_4_ = uVar91;
          auVar13._0_4_ = uVar91;
          auVar13._8_4_ = uVar91;
          auVar13._12_4_ = uVar91;
          auVar36 = vfmadd231ps_avx512vl(auVar45,auVar36,auVar13);
          auVar45 = vmovshdup_avx(auVar36);
          fVar205 = auVar45._0_4_ - auVar36._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar205));
          if (uVar5 == 0 || bVar34) goto LAB_01cc4e05;
          auVar45 = vshufps_avx(auVar51,auVar51,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar205));
          auVar43 = vsubps_avx512vl(auVar44,auVar45);
          fVar90 = auVar45._0_4_;
          auVar132._0_4_ = fVar90 * (float)local_2b8._0_4_;
          fVar198 = auVar45._4_4_;
          auVar132._4_4_ = fVar198 * (float)local_2b8._4_4_;
          fVar200 = auVar45._8_4_;
          auVar132._8_4_ = fVar200 * fStack_2b0;
          fVar202 = auVar45._12_4_;
          auVar132._12_4_ = fVar202 * fStack_2ac;
          auVar143._0_4_ = fVar90 * (float)local_2c8._0_4_;
          auVar143._4_4_ = fVar198 * (float)local_2c8._4_4_;
          auVar143._8_4_ = fVar200 * fStack_2c0;
          auVar143._12_4_ = fVar202 * fStack_2bc;
          auVar151._0_4_ = fVar90 * (float)local_2d8._0_4_;
          auVar151._4_4_ = fVar198 * (float)local_2d8._4_4_;
          auVar151._8_4_ = fVar200 * fStack_2d0;
          auVar151._12_4_ = fVar202 * fStack_2cc;
          auVar109._0_4_ = fVar90 * (float)local_2e8._0_4_;
          auVar109._4_4_ = fVar198 * (float)local_2e8._4_4_;
          auVar109._8_4_ = fVar200 * fStack_2e0;
          auVar109._12_4_ = fVar202 * fStack_2dc;
          auVar42 = vfmadd231ps_avx512vl(auVar132,auVar43,auVar47);
          auVar41 = vfmadd231ps_avx512vl(auVar143,auVar43,auVar46);
          auVar45 = vfmadd231ps_fma(auVar151,auVar43,local_298);
          auVar43 = vfmadd231ps_fma(auVar109,auVar43,local_2a8);
          auVar125._16_16_ = auVar42;
          auVar125._0_16_ = auVar42;
          auVar139._16_16_ = auVar41;
          auVar139._0_16_ = auVar41;
          auVar147._16_16_ = auVar45;
          auVar147._0_16_ = auVar45;
          auVar57 = vpermps_avx512vl(auVar239._0_32_,ZEXT1632(auVar36));
          auVar59 = vsubps_avx(auVar139,auVar125);
          auVar42 = vfmadd213ps_fma(auVar59,auVar57,auVar125);
          auVar59 = vsubps_avx(auVar147,auVar139);
          auVar41 = vfmadd213ps_fma(auVar59,auVar57,auVar139);
          auVar45 = vsubps_avx(auVar43,auVar45);
          auVar140._16_16_ = auVar45;
          auVar140._0_16_ = auVar45;
          auVar45 = vfmadd213ps_fma(auVar140,auVar57,auVar147);
          auVar59 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar42));
          auVar43 = vfmadd213ps_fma(auVar59,auVar57,ZEXT1632(auVar42));
          auVar59 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar41));
          auVar45 = vfmadd213ps_fma(auVar59,auVar57,ZEXT1632(auVar41));
          auVar59 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar43));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar59,auVar57);
          auVar59 = vmulps_avx512vl(auVar59,auVar236._0_32_);
          auVar72._16_16_ = auVar59._16_16_;
          fVar90 = fVar205 * 0.33333334;
          auVar152._0_8_ =
               CONCAT44(auVar99._4_4_ + fVar90 * auVar59._4_4_,
                        auVar99._0_4_ + fVar90 * auVar59._0_4_);
          auVar152._8_4_ = auVar99._8_4_ + fVar90 * auVar59._8_4_;
          auVar152._12_4_ = auVar99._12_4_ + fVar90 * auVar59._12_4_;
          auVar133._0_4_ = fVar90 * auVar59._16_4_;
          auVar133._4_4_ = fVar90 * auVar59._20_4_;
          auVar133._8_4_ = fVar90 * auVar59._24_4_;
          auVar133._12_4_ = fVar90 * auVar59._28_4_;
          auVar52 = vsubps_avx((undefined1  [16])0x0,auVar133);
          auVar38 = vshufpd_avx(auVar99,auVar99,3);
          auVar37 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar45 = vsubps_avx(auVar38,auVar99);
          auVar43 = vsubps_avx(auVar37,(undefined1  [16])0x0);
          auVar170._0_4_ = auVar45._0_4_ + auVar43._0_4_;
          auVar170._4_4_ = auVar45._4_4_ + auVar43._4_4_;
          auVar170._8_4_ = auVar45._8_4_ + auVar43._8_4_;
          auVar170._12_4_ = auVar45._12_4_ + auVar43._12_4_;
          auVar45 = vshufps_avx(auVar99,auVar99,0xb1);
          auVar43 = vshufps_avx(auVar152,auVar152,0xb1);
          auVar42 = vshufps_avx(auVar52,auVar52,0xb1);
          auVar41 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar224._4_4_ = auVar170._0_4_;
          auVar224._0_4_ = auVar170._0_4_;
          auVar224._8_4_ = auVar170._0_4_;
          auVar224._12_4_ = auVar170._0_4_;
          auVar39 = vshufps_avx(auVar170,auVar170,0x55);
          fVar90 = auVar39._0_4_;
          auVar181._0_4_ = auVar45._0_4_ * fVar90;
          fVar198 = auVar39._4_4_;
          auVar181._4_4_ = auVar45._4_4_ * fVar198;
          fVar200 = auVar39._8_4_;
          auVar181._8_4_ = auVar45._8_4_ * fVar200;
          fVar202 = auVar39._12_4_;
          auVar181._12_4_ = auVar45._12_4_ * fVar202;
          auVar189._0_4_ = auVar43._0_4_ * fVar90;
          auVar189._4_4_ = auVar43._4_4_ * fVar198;
          auVar189._8_4_ = auVar43._8_4_ * fVar200;
          auVar189._12_4_ = auVar43._12_4_ * fVar202;
          auVar207._0_4_ = auVar42._0_4_ * fVar90;
          auVar207._4_4_ = auVar42._4_4_ * fVar198;
          auVar207._8_4_ = auVar42._8_4_ * fVar200;
          auVar207._12_4_ = auVar42._12_4_ * fVar202;
          auVar171._0_4_ = auVar41._0_4_ * fVar90;
          auVar171._4_4_ = auVar41._4_4_ * fVar198;
          auVar171._8_4_ = auVar41._8_4_ * fVar200;
          auVar171._12_4_ = auVar41._12_4_ * fVar202;
          auVar45 = vfmadd231ps_fma(auVar181,auVar224,auVar99);
          auVar43 = vfmadd231ps_fma(auVar189,auVar224,auVar152);
          auVar50 = vfmadd231ps_fma(auVar207,auVar224,auVar52);
          auVar97 = vfmadd231ps_fma(auVar171,(undefined1  [16])0x0,auVar224);
          auVar39 = vshufpd_avx(auVar45,auVar45,1);
          auVar40 = vshufpd_avx(auVar43,auVar43,1);
          auVar48 = vshufpd_avx512vl(auVar50,auVar50,1);
          auVar49 = vshufpd_avx512vl(auVar97,auVar97,1);
          in_ZMM17 = ZEXT1664(auVar49);
          auVar42 = vminss_avx(auVar45,auVar43);
          auVar45 = vmaxss_avx(auVar43,auVar45);
          auVar41 = vminss_avx(auVar50,auVar97);
          auVar43 = vmaxss_avx(auVar97,auVar50);
          auVar42 = vminss_avx(auVar42,auVar41);
          auVar45 = vmaxss_avx(auVar43,auVar45);
          auVar41 = vminss_avx(auVar39,auVar40);
          auVar43 = vmaxss_avx(auVar40,auVar39);
          auVar39 = vminss_avx512f(auVar48,auVar49);
          auVar40 = vmaxss_avx512f(auVar49,auVar48);
          auVar43 = vmaxss_avx(auVar40,auVar43);
          auVar41 = vminss_avx512f(auVar41,auVar39);
          fVar198 = auVar43._0_4_;
          fVar90 = auVar45._0_4_;
          if (0.0001 <= auVar42._0_4_) {
LAB_01cc552f:
            vucomiss_avx512f(auVar41);
            bVar35 = fVar198 <= -0.0001;
            bVar33 = -0.0001 < fVar90;
            bVar32 = bVar35;
            if (!bVar35) goto LAB_01cc5585;
            uVar10 = vcmpps_avx512vl(auVar42,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar11 = vcmpps_avx512vl(auVar41,SUB6416(ZEXT464(0x38d1b717),0),5);
            bVar22 = (byte)uVar10 & (byte)uVar11 & 1;
            bVar35 = bVar33 && bVar22 == 0;
            bVar32 = bVar33 && bVar22 == 0;
            if (bVar33 && bVar22 == 0) goto LAB_01cc5585;
          }
          else {
            bVar35 = fVar198 == -0.0001;
            bVar32 = NAN(fVar198);
            if (fVar198 <= -0.0001) goto LAB_01cc552f;
LAB_01cc5585:
            auVar40 = vxorps_avx512vl(auVar47,auVar47);
            vcmpss_avx512f(auVar42,auVar40,1);
            uVar10 = vcmpss_avx512f(auVar45,auVar40,1);
            bVar33 = (bool)((byte)uVar10 & 1);
            auVar72._0_16_ = auVar243._0_16_;
            auVar79._4_28_ = auVar72._4_28_;
            auVar79._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar243._0_4_);
            vucomiss_avx512f(auVar79._0_16_);
            bVar32 = (bool)(!bVar35 | bVar32);
            bVar33 = bVar32 == false;
            auVar81._16_16_ = auVar72._16_16_;
            auVar81._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar80._4_28_ = auVar81._4_28_;
            auVar80._0_4_ = (uint)bVar32 * auVar40._0_4_ + (uint)!bVar32 * 0x7f800000;
            auVar39 = auVar80._0_16_;
            auVar83._16_16_ = auVar72._16_16_;
            auVar83._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar82._4_28_ = auVar83._4_28_;
            auVar82._0_4_ = (uint)bVar32 * auVar40._0_4_ + (uint)!bVar32 * -0x800000;
            auVar47 = auVar82._0_16_;
            auVar46 = vxorps_avx512vl(auVar46,auVar46);
            uVar10 = vcmpss_avx512f(auVar41,auVar40,1);
            bVar35 = (bool)((byte)uVar10 & 1);
            auVar85._16_16_ = auVar72._16_16_;
            auVar85._0_16_ = auVar243._0_16_;
            auVar84._4_28_ = auVar85._4_28_;
            auVar84._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar243._0_4_);
            vucomiss_avx512f(auVar84._0_16_);
            if ((bVar32) || (bVar33)) {
              auVar41 = vucomiss_avx512f(auVar42);
              if ((bVar32) || (bVar33)) {
                auVar40 = vxorps_avx512vl(auVar42,auVar235._0_16_);
                auVar42 = vsubss_avx512f(auVar41,auVar42);
                auVar42 = vdivss_avx512f(auVar40,auVar42);
                auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
                auVar41 = vfmadd213ss_avx512f(auVar41,auVar46,auVar42);
                auVar42 = auVar41;
              }
              else {
                auVar42 = vxorps_avx512vl(auVar41,auVar41);
                vucomiss_avx512f(auVar42);
                auVar41 = ZEXT416(0x3f800000);
                if ((bVar32) || (bVar33)) {
                  auVar41 = SUB6416(ZEXT464(0xff800000),0);
                  auVar42 = SUB6416(ZEXT464(0x7f800000),0);
                }
              }
              auVar39 = vminss_avx512f(auVar39,auVar42);
              auVar47 = vmaxss_avx(auVar41,auVar47);
            }
            auVar243 = ZEXT464(0x3f800000);
            in_ZMM17 = ZEXT1664(local_288);
            uVar10 = vcmpss_avx512f(auVar43,auVar46,1);
            bVar35 = (bool)((byte)uVar10 & 1);
            auVar43 = auVar243._0_16_;
            fVar200 = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * 0x3f800000);
            if ((auVar79._0_4_ != fVar200) || (NAN(auVar79._0_4_) || NAN(fVar200))) {
              if ((fVar198 != fVar90) || (NAN(fVar198) || NAN(fVar90))) {
                auVar45 = vxorps_avx512vl(auVar45,auVar235._0_16_);
                auVar172._0_4_ = auVar45._0_4_ / (fVar198 - fVar90);
                auVar172._4_12_ = auVar45._4_12_;
                auVar45 = vsubss_avx512f(auVar43,auVar172);
                auVar45 = vfmadd213ss_avx512f(auVar45,auVar46,auVar172);
                auVar42 = auVar45;
              }
              else if ((fVar90 != 0.0) ||
                      (auVar45 = auVar43, auVar42 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar90))) {
                auVar45 = SUB6416(ZEXT464(0xff800000),0);
                auVar42 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar39 = vminss_avx(auVar39,auVar42);
              auVar47 = vmaxss_avx(auVar45,auVar47);
            }
            bVar35 = auVar84._0_4_ != fVar200;
            auVar45 = vminss_avx512f(auVar39,auVar43);
            auVar87._16_16_ = auVar72._16_16_;
            auVar87._0_16_ = auVar39;
            auVar86._4_28_ = auVar87._4_28_;
            auVar86._0_4_ = (uint)bVar35 * auVar45._0_4_ + (uint)!bVar35 * auVar39._0_4_;
            auVar45 = vmaxss_avx512f(auVar43,auVar47);
            auVar89._16_16_ = auVar72._16_16_;
            auVar89._0_16_ = auVar47;
            auVar88._4_28_ = auVar89._4_28_;
            auVar88._0_4_ = (uint)bVar35 * auVar45._0_4_ + (uint)!bVar35 * auVar47._0_4_;
            auVar47 = vmaxss_avx512f(auVar46,auVar86._0_16_);
            auVar45 = vminss_avx512f(auVar88._0_16_,auVar43);
            if (auVar47._0_4_ <= auVar45._0_4_) {
              auVar41 = vmaxss_avx512f(auVar46,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
              auVar50 = vminss_avx512f(ZEXT416((uint)(auVar45._0_4_ + 0.1)),auVar43);
              auVar110._0_8_ = auVar99._0_8_;
              auVar110._8_8_ = auVar110._0_8_;
              auVar190._8_8_ = auVar152._0_8_;
              auVar190._0_8_ = auVar152._0_8_;
              auVar208._8_8_ = auVar52._0_8_;
              auVar208._0_8_ = auVar52._0_8_;
              auVar47 = vshufpd_avx(auVar152,auVar152,3);
              auVar45 = vshufpd_avx(auVar52,auVar52,3);
              auVar42 = vshufps_avx(auVar41,auVar50,0);
              auVar40 = vsubps_avx512vl(auVar44,auVar42);
              fVar90 = auVar42._0_4_;
              auVar144._0_4_ = fVar90 * auVar38._0_4_;
              fVar198 = auVar42._4_4_;
              auVar144._4_4_ = fVar198 * auVar38._4_4_;
              fVar200 = auVar42._8_4_;
              auVar144._8_4_ = fVar200 * auVar38._8_4_;
              fVar202 = auVar42._12_4_;
              auVar144._12_4_ = fVar202 * auVar38._12_4_;
              auVar153._0_4_ = fVar90 * auVar47._0_4_;
              auVar153._4_4_ = fVar198 * auVar47._4_4_;
              auVar153._8_4_ = fVar200 * auVar47._8_4_;
              auVar153._12_4_ = fVar202 * auVar47._12_4_;
              auVar227._0_4_ = auVar45._0_4_ * fVar90;
              auVar227._4_4_ = auVar45._4_4_ * fVar198;
              auVar227._8_4_ = auVar45._8_4_ * fVar200;
              auVar227._12_4_ = auVar45._12_4_ * fVar202;
              auVar134._0_4_ = fVar90 * auVar37._0_4_;
              auVar134._4_4_ = fVar198 * auVar37._4_4_;
              auVar134._8_4_ = fVar200 * auVar37._8_4_;
              auVar134._12_4_ = fVar202 * auVar37._12_4_;
              auVar38 = vfmadd231ps_fma(auVar144,auVar40,auVar110);
              auVar37 = vfmadd231ps_fma(auVar153,auVar40,auVar190);
              auVar39 = vfmadd231ps_fma(auVar227,auVar40,auVar208);
              auVar40 = vfmadd231ps_fma(auVar134,auVar40,ZEXT816(0));
              auVar45 = vsubss_avx512f(auVar43,auVar41);
              auVar47 = vmovshdup_avx(auVar51);
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar41._0_4_)),auVar51,
                                        auVar45);
              auVar45 = vsubss_avx512f(auVar43,auVar50);
              auVar99 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar50._0_4_)),auVar51,
                                        auVar45);
              auVar51 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar205));
              auVar47 = vsubps_avx(auVar37,auVar38);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar42 = vmulps_avx512vl(auVar47,auVar52);
              auVar47 = vsubps_avx(auVar39,auVar37);
              auVar41 = vmulps_avx512vl(auVar47,auVar52);
              auVar47 = vsubps_avx(auVar40,auVar39);
              auVar47 = vmulps_avx512vl(auVar47,auVar52);
              auVar45 = vminps_avx(auVar41,auVar47);
              auVar47 = vmaxps_avx(auVar41,auVar47);
              auVar45 = vminps_avx(auVar42,auVar45);
              auVar47 = vmaxps_avx(auVar42,auVar47);
              auVar42 = vshufpd_avx(auVar45,auVar45,3);
              auVar41 = vshufpd_avx(auVar47,auVar47,3);
              auVar45 = vminps_avx(auVar45,auVar42);
              auVar47 = vmaxps_avx(auVar47,auVar41);
              fVar205 = auVar51._0_4_;
              auVar173._0_4_ = auVar45._0_4_ * fVar205;
              auVar173._4_4_ = auVar45._4_4_ * fVar205;
              auVar173._8_4_ = auVar45._8_4_ * fVar205;
              auVar173._12_4_ = auVar45._12_4_ * fVar205;
              auVar162._0_4_ = fVar205 * auVar47._0_4_;
              auVar162._4_4_ = fVar205 * auVar47._4_4_;
              auVar162._8_4_ = fVar205 * auVar47._8_4_;
              auVar162._12_4_ = fVar205 * auVar47._12_4_;
              auVar50 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar99._0_4_ - auVar97._0_4_)));
              auVar47 = vshufpd_avx(auVar38,auVar38,3);
              auVar45 = vshufpd_avx(auVar37,auVar37,3);
              auVar42 = vshufpd_avx(auVar39,auVar39,3);
              auVar41 = vshufpd_avx(auVar40,auVar40,3);
              auVar47 = vsubps_avx(auVar47,auVar38);
              auVar38 = vsubps_avx(auVar45,auVar37);
              auVar51 = vsubps_avx(auVar42,auVar39);
              auVar41 = vsubps_avx(auVar41,auVar40);
              auVar45 = vminps_avx(auVar47,auVar38);
              auVar47 = vmaxps_avx(auVar47,auVar38);
              auVar42 = vminps_avx(auVar51,auVar41);
              auVar42 = vminps_avx(auVar45,auVar42);
              auVar45 = vmaxps_avx(auVar51,auVar41);
              auVar47 = vmaxps_avx(auVar47,auVar45);
              fVar205 = auVar50._0_4_;
              auVar209._0_4_ = fVar205 * auVar42._0_4_;
              auVar209._4_4_ = fVar205 * auVar42._4_4_;
              auVar209._8_4_ = fVar205 * auVar42._8_4_;
              auVar209._12_4_ = fVar205 * auVar42._12_4_;
              auVar191._0_4_ = fVar205 * auVar47._0_4_;
              auVar191._4_4_ = fVar205 * auVar47._4_4_;
              auVar191._8_4_ = fVar205 * auVar47._8_4_;
              auVar191._12_4_ = fVar205 * auVar47._12_4_;
              auVar41 = vinsertps_avx(auVar36,auVar97,0x10);
              auVar48 = vpermt2ps_avx512vl(auVar36,_DAT_01feecd0,auVar99);
              auVar98._0_4_ = auVar41._0_4_ + auVar48._0_4_;
              auVar98._4_4_ = auVar41._4_4_ + auVar48._4_4_;
              auVar98._8_4_ = auVar41._8_4_ + auVar48._8_4_;
              auVar98._12_4_ = auVar41._12_4_ + auVar48._12_4_;
              auVar40 = vmulps_avx512vl(auVar98,auVar233._0_16_);
              auVar45 = vshufps_avx(auVar40,auVar40,0x54);
              uVar91 = auVar40._0_4_;
              auVar102._4_4_ = uVar91;
              auVar102._0_4_ = uVar91;
              auVar102._8_4_ = uVar91;
              auVar102._12_4_ = uVar91;
              auVar51 = vfmadd213ps_avx512vl(auVar241._0_16_,auVar102,local_288);
              auVar42 = vfmadd213ps_fma(auVar244._0_16_,auVar102,local_198);
              auVar38 = vfmadd213ps_fma(local_108,auVar102,local_1a8);
              auVar47 = vsubps_avx(auVar42,auVar51);
              auVar51 = vfmadd213ps_fma(auVar47,auVar102,auVar51);
              auVar47 = vsubps_avx(auVar38,auVar42);
              auVar47 = vfmadd213ps_fma(auVar47,auVar102,auVar42);
              auVar47 = vsubps_avx(auVar47,auVar51);
              auVar42 = vfmadd231ps_fma(auVar51,auVar47,auVar102);
              auVar37 = vmulps_avx512vl(auVar47,auVar52);
              auVar217._8_8_ = auVar42._0_8_;
              auVar217._0_8_ = auVar42._0_8_;
              auVar47 = vshufpd_avx(auVar42,auVar42,3);
              auVar42 = vshufps_avx(auVar40,auVar40,0x55);
              auVar38 = vsubps_avx(auVar47,auVar217);
              auVar51 = vfmadd231ps_fma(auVar217,auVar42,auVar38);
              auVar228._8_8_ = auVar37._0_8_;
              auVar228._0_8_ = auVar37._0_8_;
              auVar47 = vshufpd_avx(auVar37,auVar37,3);
              auVar47 = vsubps_avx512vl(auVar47,auVar228);
              auVar47 = vfmadd213ps_avx512vl(auVar47,auVar42,auVar228);
              auVar103._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
              auVar103._8_4_ = auVar38._8_4_ ^ 0x80000000;
              auVar103._12_4_ = auVar38._12_4_ ^ 0x80000000;
              auVar42 = vmovshdup_avx512vl(auVar47);
              auVar229._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar42._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar42._12_4_ ^ 0x80000000;
              auVar37 = vmovshdup_avx512vl(auVar38);
              auVar39 = vpermt2ps_avx512vl(auVar229,ZEXT416(5),auVar38);
              auVar42 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar42._0_4_ * auVar38._0_4_)),auVar47,
                                            auVar37);
              auVar38 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar103);
              auVar135._0_4_ = auVar42._0_4_;
              auVar135._4_4_ = auVar135._0_4_;
              auVar135._8_4_ = auVar135._0_4_;
              auVar135._12_4_ = auVar135._0_4_;
              auVar47 = vdivps_avx(auVar39,auVar135);
              auVar49 = vdivps_avx512vl(auVar38,auVar135);
              fVar205 = auVar51._0_4_;
              auVar42 = vshufps_avx(auVar51,auVar51,0x55);
              auVar218._0_4_ = fVar205 * auVar47._0_4_ + auVar42._0_4_ * auVar49._0_4_;
              auVar218._4_4_ = fVar205 * auVar47._4_4_ + auVar42._4_4_ * auVar49._4_4_;
              auVar218._8_4_ = fVar205 * auVar47._8_4_ + auVar42._8_4_ * auVar49._8_4_;
              auVar218._12_4_ = fVar205 * auVar47._12_4_ + auVar42._12_4_ * auVar49._12_4_;
              auVar52 = vsubps_avx(auVar45,auVar218);
              auVar42 = vmovshdup_avx(auVar47);
              auVar45 = vinsertps_avx(auVar173,auVar209,0x1c);
              auVar230._0_4_ = auVar42._0_4_ * auVar45._0_4_;
              auVar230._4_4_ = auVar42._4_4_ * auVar45._4_4_;
              auVar230._8_4_ = auVar42._8_4_ * auVar45._8_4_;
              auVar230._12_4_ = auVar42._12_4_ * auVar45._12_4_;
              auVar50 = vinsertps_avx512f(auVar162,auVar191,0x1c);
              auVar42 = vmulps_avx512vl(auVar42,auVar50);
              auVar39 = vminps_avx512vl(auVar230,auVar42);
              auVar51 = vmaxps_avx(auVar42,auVar230);
              auVar37 = vmovshdup_avx(auVar49);
              auVar42 = vinsertps_avx(auVar209,auVar173,0x4c);
              auVar210._0_4_ = auVar37._0_4_ * auVar42._0_4_;
              auVar210._4_4_ = auVar37._4_4_ * auVar42._4_4_;
              auVar210._8_4_ = auVar37._8_4_ * auVar42._8_4_;
              auVar210._12_4_ = auVar37._12_4_ * auVar42._12_4_;
              auVar38 = vinsertps_avx(auVar191,auVar162,0x4c);
              auVar192._0_4_ = auVar37._0_4_ * auVar38._0_4_;
              auVar192._4_4_ = auVar37._4_4_ * auVar38._4_4_;
              auVar192._8_4_ = auVar37._8_4_ * auVar38._8_4_;
              auVar192._12_4_ = auVar37._12_4_ * auVar38._12_4_;
              auVar37 = vminps_avx(auVar210,auVar192);
              auVar39 = vaddps_avx512vl(auVar39,auVar37);
              auVar37 = vmaxps_avx(auVar192,auVar210);
              auVar193._0_4_ = auVar51._0_4_ + auVar37._0_4_;
              auVar193._4_4_ = auVar51._4_4_ + auVar37._4_4_;
              auVar193._8_4_ = auVar51._8_4_ + auVar37._8_4_;
              auVar193._12_4_ = auVar51._12_4_ + auVar37._12_4_;
              auVar211._8_8_ = 0x3f80000000000000;
              auVar211._0_8_ = 0x3f80000000000000;
              auVar51 = vsubps_avx(auVar211,auVar193);
              auVar37 = vsubps_avx(auVar211,auVar39);
              auVar39 = vsubps_avx(auVar41,auVar40);
              auVar40 = vsubps_avx(auVar48,auVar40);
              fVar202 = auVar39._0_4_;
              auVar231._0_4_ = fVar202 * auVar51._0_4_;
              fVar203 = auVar39._4_4_;
              auVar231._4_4_ = fVar203 * auVar51._4_4_;
              fVar204 = auVar39._8_4_;
              auVar231._8_4_ = fVar204 * auVar51._8_4_;
              fVar96 = auVar39._12_4_;
              auVar231._12_4_ = fVar96 * auVar51._12_4_;
              auVar53 = vbroadcastss_avx512vl(auVar47);
              auVar45 = vmulps_avx512vl(auVar53,auVar45);
              auVar50 = vmulps_avx512vl(auVar53,auVar50);
              auVar53 = vminps_avx512vl(auVar45,auVar50);
              auVar50 = vmaxps_avx512vl(auVar50,auVar45);
              auVar45 = vbroadcastss_avx512vl(auVar49);
              auVar42 = vmulps_avx512vl(auVar45,auVar42);
              auVar45 = vmulps_avx512vl(auVar45,auVar38);
              auVar38 = vminps_avx512vl(auVar42,auVar45);
              auVar38 = vaddps_avx512vl(auVar53,auVar38);
              auVar39 = vmulps_avx512vl(auVar39,auVar37);
              in_ZMM17 = ZEXT1664(auVar39);
              fVar205 = auVar40._0_4_;
              auVar194._0_4_ = fVar205 * auVar51._0_4_;
              fVar90 = auVar40._4_4_;
              auVar194._4_4_ = fVar90 * auVar51._4_4_;
              fVar198 = auVar40._8_4_;
              auVar194._8_4_ = fVar198 * auVar51._8_4_;
              fVar200 = auVar40._12_4_;
              auVar194._12_4_ = fVar200 * auVar51._12_4_;
              auVar212._0_4_ = fVar205 * auVar37._0_4_;
              auVar212._4_4_ = fVar90 * auVar37._4_4_;
              auVar212._8_4_ = fVar198 * auVar37._8_4_;
              auVar212._12_4_ = fVar200 * auVar37._12_4_;
              auVar45 = vmaxps_avx(auVar45,auVar42);
              auVar163._0_4_ = auVar50._0_4_ + auVar45._0_4_;
              auVar163._4_4_ = auVar50._4_4_ + auVar45._4_4_;
              auVar163._8_4_ = auVar50._8_4_ + auVar45._8_4_;
              auVar163._12_4_ = auVar50._12_4_ + auVar45._12_4_;
              auVar174._8_8_ = 0x3f800000;
              auVar174._0_8_ = 0x3f800000;
              auVar45 = vsubps_avx(auVar174,auVar163);
              auVar42 = vsubps_avx512vl(auVar174,auVar38);
              auVar225._0_4_ = fVar202 * auVar45._0_4_;
              auVar225._4_4_ = fVar203 * auVar45._4_4_;
              auVar225._8_4_ = fVar204 * auVar45._8_4_;
              auVar225._12_4_ = fVar96 * auVar45._12_4_;
              auVar219._0_4_ = fVar202 * auVar42._0_4_;
              auVar219._4_4_ = fVar203 * auVar42._4_4_;
              auVar219._8_4_ = fVar204 * auVar42._8_4_;
              auVar219._12_4_ = fVar96 * auVar42._12_4_;
              auVar164._0_4_ = fVar205 * auVar45._0_4_;
              auVar164._4_4_ = fVar90 * auVar45._4_4_;
              auVar164._8_4_ = fVar198 * auVar45._8_4_;
              auVar164._12_4_ = fVar200 * auVar45._12_4_;
              auVar175._0_4_ = fVar205 * auVar42._0_4_;
              auVar175._4_4_ = fVar90 * auVar42._4_4_;
              auVar175._8_4_ = fVar198 * auVar42._8_4_;
              auVar175._12_4_ = fVar200 * auVar42._12_4_;
              auVar45 = vminps_avx(auVar225,auVar219);
              auVar42 = vminps_avx512vl(auVar164,auVar175);
              auVar38 = vminps_avx512vl(auVar45,auVar42);
              auVar45 = vmaxps_avx(auVar219,auVar225);
              auVar42 = vmaxps_avx(auVar175,auVar164);
              auVar42 = vmaxps_avx(auVar42,auVar45);
              auVar51 = vminps_avx512vl(auVar231,auVar39);
              auVar45 = vminps_avx(auVar194,auVar212);
              auVar45 = vminps_avx(auVar51,auVar45);
              auVar45 = vhaddps_avx(auVar38,auVar45);
              auVar51 = vmaxps_avx512vl(auVar39,auVar231);
              auVar38 = vmaxps_avx(auVar212,auVar194);
              auVar38 = vmaxps_avx(auVar38,auVar51);
              auVar42 = vhaddps_avx(auVar42,auVar38);
              auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
              auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
              auVar165._0_4_ = auVar45._0_4_ + auVar52._0_4_;
              auVar165._4_4_ = auVar45._4_4_ + auVar52._4_4_;
              auVar165._8_4_ = auVar45._8_4_ + auVar52._8_4_;
              auVar165._12_4_ = auVar45._12_4_ + auVar52._12_4_;
              auVar176._0_4_ = auVar42._0_4_ + auVar52._0_4_;
              auVar176._4_4_ = auVar42._4_4_ + auVar52._4_4_;
              auVar176._8_4_ = auVar42._8_4_ + auVar52._8_4_;
              auVar176._12_4_ = auVar42._12_4_ + auVar52._12_4_;
              auVar45 = vmaxps_avx(auVar41,auVar165);
              auVar42 = vminps_avx(auVar176,auVar48);
              uVar31 = vcmpps_avx512vl(auVar42,auVar45,1);
              if ((uVar31 & 3) == 0) {
                uVar31 = vcmpps_avx512vl(auVar176,auVar48,1);
                uVar10 = vcmpps_avx512vl(auVar36,auVar165,1);
                if (((ushort)uVar10 & (ushort)uVar31 & 1) == 0) {
                  bVar22 = 0;
                }
                else {
                  auVar45 = vmovshdup_avx(auVar165);
                  bVar22 = auVar97._0_4_ < auVar45._0_4_ & (byte)(uVar31 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar24 || uVar5 != 0 && !bVar34) | bVar22) != 1) {
                  auVar51 = vinsertps_avx(auVar97,auVar99,0x10);
                  auVar240 = ZEXT1664(local_1b8);
                  auVar242 = ZEXT1664(local_1c8);
                  goto LAB_01cc4e05;
                }
                lVar26 = 200;
                do {
                  auVar36 = vsubss_avx512f(auVar43,auVar52);
                  fVar198 = auVar36._0_4_;
                  fVar205 = fVar198 * fVar198 * fVar198;
                  auVar36 = vmulss_avx512f(auVar52,ZEXT416(0x40400000));
                  fVar90 = auVar36._0_4_ * fVar198 * fVar198;
                  fVar200 = auVar52._0_4_;
                  auVar36 = vmulss_avx512f(ZEXT416((uint)(fVar200 * fVar200)),ZEXT416(0x40400000));
                  fVar198 = fVar198 * auVar36._0_4_;
                  auVar122._4_4_ = fVar205;
                  auVar122._0_4_ = fVar205;
                  auVar122._8_4_ = fVar205;
                  auVar122._12_4_ = fVar205;
                  auVar111._4_4_ = fVar90;
                  auVar111._0_4_ = fVar90;
                  auVar111._8_4_ = fVar90;
                  auVar111._12_4_ = fVar90;
                  auVar93._4_4_ = fVar198;
                  auVar93._0_4_ = fVar198;
                  auVar93._8_4_ = fVar198;
                  auVar93._12_4_ = fVar198;
                  fVar200 = fVar200 * fVar200 * fVar200;
                  auVar145._0_4_ = (float)local_f8._0_4_ * fVar200;
                  auVar145._4_4_ = (float)local_f8._4_4_ * fVar200;
                  auVar145._8_4_ = fStack_f0 * fVar200;
                  auVar145._12_4_ = fStack_ec * fVar200;
                  auVar36 = vfmadd231ps_fma(auVar145,local_1a8,auVar93);
                  auVar36 = vfmadd231ps_fma(auVar36,local_198,auVar111);
                  auVar36 = vfmadd231ps_fma(auVar36,local_288,auVar122);
                  auVar94._8_8_ = auVar36._0_8_;
                  auVar94._0_8_ = auVar36._0_8_;
                  auVar36 = vshufpd_avx(auVar36,auVar36,3);
                  auVar45 = vshufps_avx(auVar52,auVar52,0x55);
                  auVar36 = vsubps_avx(auVar36,auVar94);
                  auVar45 = vfmadd213ps_fma(auVar36,auVar45,auVar94);
                  fVar205 = auVar45._0_4_;
                  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
                  auVar95._0_4_ = auVar47._0_4_ * fVar205 + auVar49._0_4_ * auVar36._0_4_;
                  auVar95._4_4_ = auVar47._4_4_ * fVar205 + auVar49._4_4_ * auVar36._4_4_;
                  auVar95._8_4_ = auVar47._8_4_ * fVar205 + auVar49._8_4_ * auVar36._8_4_;
                  auVar95._12_4_ = auVar47._12_4_ * fVar205 + auVar49._12_4_ * auVar36._12_4_;
                  auVar52 = vsubps_avx(auVar52,auVar95);
                  auVar36 = vandps_avx512vl(auVar45,auVar234._0_16_);
                  auVar45 = vprolq_avx512vl(auVar36,0x20);
                  auVar36 = vmaxss_avx(auVar45,auVar36);
                  bVar34 = auVar36._0_4_ <= (float)local_e8._0_4_;
                  if (auVar36._0_4_ < (float)local_e8._0_4_) {
                    auVar36 = vucomiss_avx512f(auVar46);
                    if (bVar34) {
                      auVar47 = vucomiss_avx512f(auVar36);
                      auVar243 = ZEXT1664(auVar47);
                      if (bVar34) {
                        vmovshdup_avx(auVar36);
                        auVar47 = vucomiss_avx512f(auVar46);
                        if (bVar34) {
                          auVar46 = vucomiss_avx512f(auVar47);
                          auVar243 = ZEXT1664(auVar46);
                          if (bVar34) {
                            auVar45 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar39 = vinsertps_avx(auVar45,ZEXT416((uint)(pre->ray_space).vz.
                                                                          field_0.m128[2]),0x28);
                            aVar1 = (ray->super_RayK<1>).org.field_0;
                            auVar45 = vsubps_avx(local_1d8,(undefined1  [16])aVar1);
                            auVar45 = vdpps_avx(auVar45,auVar39,0x7f);
                            auVar43 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                            auVar43 = vdpps_avx(auVar43,auVar39,0x7f);
                            auVar42 = vsubps_avx(local_228,(undefined1  [16])aVar1);
                            auVar42 = vdpps_avx(auVar42,auVar39,0x7f);
                            auVar41 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
                            auVar41 = vdpps_avx(auVar41,auVar39,0x7f);
                            auVar38 = vsubps_avx(_local_1e8,(undefined1  [16])aVar1);
                            auVar38 = vdpps_avx(auVar38,auVar39,0x7f);
                            auVar51 = vsubps_avx(_local_238,(undefined1  [16])aVar1);
                            auVar51 = vdpps_avx(auVar51,auVar39,0x7f);
                            auVar37 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                            auVar37 = vdpps_avx(auVar37,auVar39,0x7f);
                            auVar40 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
                            auVar39 = vdpps_avx(auVar40,auVar39,0x7f);
                            auVar40 = vsubss_avx512f(auVar46,auVar47);
                            fVar205 = auVar47._0_4_;
                            auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar205)),
                                                      auVar40,auVar45);
                            auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * fVar205)),
                                                      auVar40,auVar43);
                            auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * fVar205)),
                                                      auVar40,auVar42);
                            auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar39._0_4_)),
                                                      auVar40,auVar41);
                            auVar46 = vsubss_avx512f(auVar46,auVar36);
                            auVar146._0_4_ = auVar46._0_4_;
                            fVar90 = auVar146._0_4_ * auVar146._0_4_ * auVar146._0_4_;
                            auVar46 = vmulss_avx512f(auVar36,ZEXT416(0x40400000));
                            fVar198 = auVar46._0_4_ * auVar146._0_4_ * auVar146._0_4_;
                            fVar205 = auVar36._0_4_;
                            auVar136._0_4_ = fVar205 * fVar205;
                            auVar136._4_4_ = auVar36._4_4_ * auVar36._4_4_;
                            auVar136._8_4_ = auVar36._8_4_ * auVar36._8_4_;
                            auVar136._12_4_ = auVar36._12_4_ * auVar36._12_4_;
                            auVar46 = vmulss_avx512f(auVar136,ZEXT416(0x40400000));
                            fVar200 = auVar146._0_4_ * auVar46._0_4_;
                            fVar203 = fVar205 * auVar136._0_4_;
                            auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar42._0_4_)),
                                                      ZEXT416((uint)fVar200),auVar43);
                            auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar198),auVar45);
                            auVar47 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar90),auVar47);
                            fVar202 = auVar47._0_4_;
                            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar202) &&
                               (fVar204 = (ray->super_RayK<1>).tfar, fVar202 <= fVar204)) {
                              auVar47 = vshufps_avx(auVar36,auVar36,0x55);
                              auVar44 = vsubps_avx512vl(auVar44,auVar47);
                              fVar96 = auVar47._0_4_;
                              auVar177._0_4_ = fVar96 * (float)local_1e8._0_4_;
                              fVar108 = auVar47._4_4_;
                              auVar177._4_4_ = fVar108 * (float)local_1e8._4_4_;
                              fVar115 = auVar47._8_4_;
                              auVar177._8_4_ = fVar115 * fStack_1e0;
                              fVar116 = auVar47._12_4_;
                              auVar177._12_4_ = fVar116 * fStack_1dc;
                              auVar182._0_4_ = fVar96 * (float)local_238._0_4_;
                              auVar182._4_4_ = fVar108 * (float)local_238._4_4_;
                              auVar182._8_4_ = fVar115 * fStack_230;
                              auVar182._12_4_ = fVar116 * fStack_22c;
                              auVar195._0_4_ = fVar96 * (float)local_248._0_4_;
                              auVar195._4_4_ = fVar108 * (float)local_248._4_4_;
                              auVar195._8_4_ = fVar115 * fStack_240;
                              auVar195._12_4_ = fVar116 * fStack_23c;
                              auVar154._0_4_ = fVar96 * (float)local_208._0_4_;
                              auVar154._4_4_ = fVar108 * (float)local_208._4_4_;
                              auVar154._8_4_ = fVar115 * fStack_200;
                              auVar154._12_4_ = fVar116 * fStack_1fc;
                              auVar47 = vfmadd231ps_fma(auVar177,auVar44,local_1d8);
                              auVar46 = vfmadd231ps_fma(auVar182,auVar44,local_218);
                              auVar45 = vfmadd231ps_fma(auVar195,auVar44,local_228);
                              auVar44 = vfmadd231ps_fma(auVar154,auVar44,local_1f8);
                              auVar47 = vsubps_avx(auVar46,auVar47);
                              auVar46 = vsubps_avx(auVar45,auVar46);
                              auVar45 = vsubps_avx(auVar44,auVar45);
                              auVar196._0_4_ = fVar205 * auVar46._0_4_;
                              auVar196._4_4_ = fVar205 * auVar46._4_4_;
                              auVar196._8_4_ = fVar205 * auVar46._8_4_;
                              auVar196._12_4_ = fVar205 * auVar46._12_4_;
                              auVar146._4_4_ = auVar146._0_4_;
                              auVar146._8_4_ = auVar146._0_4_;
                              auVar146._12_4_ = auVar146._0_4_;
                              auVar47 = vfmadd231ps_fma(auVar196,auVar146,auVar47);
                              auVar155._0_4_ = fVar205 * auVar45._0_4_;
                              auVar155._4_4_ = fVar205 * auVar45._4_4_;
                              auVar155._8_4_ = fVar205 * auVar45._8_4_;
                              auVar155._12_4_ = fVar205 * auVar45._12_4_;
                              auVar46 = vfmadd231ps_fma(auVar155,auVar146,auVar46);
                              auVar156._0_4_ = fVar205 * auVar46._0_4_;
                              auVar156._4_4_ = fVar205 * auVar46._4_4_;
                              auVar156._8_4_ = fVar205 * auVar46._8_4_;
                              auVar156._12_4_ = fVar205 * auVar46._12_4_;
                              auVar47 = vfmadd231ps_fma(auVar156,auVar146,auVar47);
                              auVar14._8_4_ = 0x40400000;
                              auVar14._0_8_ = 0x4040000040400000;
                              auVar14._12_4_ = 0x40400000;
                              auVar47 = vmulps_avx512vl(auVar47,auVar14);
                              pGVar6 = (context->scene->geometries).items[uVar29].ptr;
                              if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                                auVar137._0_4_ = fVar203 * (float)local_148._0_4_;
                                auVar137._4_4_ = fVar203 * (float)local_148._4_4_;
                                auVar137._8_4_ = fVar203 * fStack_140;
                                auVar137._12_4_ = fVar203 * fStack_13c;
                                auVar123._4_4_ = fVar200;
                                auVar123._0_4_ = fVar200;
                                auVar123._8_4_ = fVar200;
                                auVar123._12_4_ = fVar200;
                                auVar46 = vfmadd132ps_fma(auVar123,auVar137,local_138);
                                auVar112._4_4_ = fVar198;
                                auVar112._0_4_ = fVar198;
                                auVar112._8_4_ = fVar198;
                                auVar112._12_4_ = fVar198;
                                auVar46 = vfmadd132ps_fma(auVar112,auVar46,local_128);
                                auVar104._4_4_ = fVar90;
                                auVar104._0_4_ = fVar90;
                                auVar104._8_4_ = fVar90;
                                auVar104._12_4_ = fVar90;
                                auVar44 = vfmadd132ps_fma(auVar104,auVar46,local_118);
                                auVar46 = vshufps_avx(auVar44,auVar44,0xc9);
                                auVar45 = vshufps_avx(auVar47,auVar47,0xc9);
                                auVar105._0_4_ = auVar44._0_4_ * auVar45._0_4_;
                                auVar105._4_4_ = auVar44._4_4_ * auVar45._4_4_;
                                auVar105._8_4_ = auVar44._8_4_ * auVar45._8_4_;
                                auVar105._12_4_ = auVar44._12_4_ * auVar45._12_4_;
                                auVar47 = vfmsub231ps_fma(auVar105,auVar47,auVar46);
                                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                  (ray->super_RayK<1>).tfar = fVar202;
                                  auVar46 = vshufps_avx(auVar47,auVar47,0xe9);
                                  uVar10 = vmovlps_avx(auVar46);
                                  *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                                  (ray->Ng).field_0.field_0.z = auVar47._0_4_;
                                  uVar10 = vmovlps_avx(auVar36);
                                  ray->u = (float)(int)uVar10;
                                  ray->v = (float)(int)((ulong)uVar10 >> 0x20);
                                  ray->primID = (uint)local_2f0;
                                  ray->geomID = uVar29;
                                  ray->instID[0] = context->user->instID[0];
                                  ray->instPrimID[0] = context->user->instPrimID[0];
                                }
                                else {
                                  auVar46 = vshufps_avx(auVar47,auVar47,0xe9);
                                  local_178 = vmovlps_avx(auVar46);
                                  local_170 = auVar47._0_4_;
                                  local_16c = vmovlps_avx(auVar36);
                                  local_164 = (uint)local_2f0;
                                  local_160 = uVar29;
                                  local_15c = context->user->instID[0];
                                  local_158 = context->user->instPrimID[0];
                                  (ray->super_RayK<1>).tfar = fVar202;
                                  local_31c = -1;
                                  local_278.valid = &local_31c;
                                  local_278.geometryUserPtr = pGVar6->userPtr;
                                  local_278.context = context->user;
                                  local_278.ray = (RTCRayN *)ray;
                                  local_278.hit = (RTCHitN *)&local_178;
                                  local_278.N = 1;
                                  if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01cc608e:
                                    p_Var7 = context->args->filter;
                                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var7)(&local_278);
                                      auVar244 = ZEXT1664(local_318);
                                      auVar241 = ZEXT1664(local_308);
                                      auVar243 = ZEXT464(0x3f800000);
                                      auVar239 = ZEXT3264(_DAT_01feed20);
                                      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar238 = ZEXT1664(auVar36);
                                      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar237 = ZEXT1664(auVar36);
                                      auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar236 = ZEXT3264(auVar59);
                                      auVar72._16_16_ = auVar59._16_16_;
                                      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar235 = ZEXT1664(auVar36);
                                      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar234 = ZEXT1664(auVar36);
                                      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar233 = ZEXT1664(auVar36);
                                      if (*local_278.valid == 0) goto LAB_01cc61a5;
                                    }
                                    (((Vec3f *)((long)local_278.ray + 0x30))->field_0).components[0]
                                         = *(float *)local_278.hit;
                                    (((Vec3f *)((long)local_278.ray + 0x30))->field_0).field_0.y =
                                         *(float *)(local_278.hit + 4);
                                    (((Vec3f *)((long)local_278.ray + 0x30))->field_0).field_0.z =
                                         *(float *)(local_278.hit + 8);
                                    *(float *)((long)local_278.ray + 0x3c) =
                                         *(float *)(local_278.hit + 0xc);
                                    *(float *)((long)local_278.ray + 0x40) =
                                         *(float *)(local_278.hit + 0x10);
                                    *(float *)((long)local_278.ray + 0x44) =
                                         *(float *)(local_278.hit + 0x14);
                                    *(float *)((long)local_278.ray + 0x48) =
                                         *(float *)(local_278.hit + 0x18);
                                    *(float *)((long)local_278.ray + 0x4c) =
                                         *(float *)(local_278.hit + 0x1c);
                                    *(float *)((long)local_278.ray + 0x50) =
                                         *(float *)(local_278.hit + 0x20);
                                  }
                                  else {
                                    (*pGVar6->intersectionFilterN)(&local_278);
                                    auVar244 = ZEXT1664(local_318);
                                    auVar241 = ZEXT1664(local_308);
                                    auVar243 = ZEXT464(0x3f800000);
                                    auVar239 = ZEXT3264(_DAT_01feed20);
                                    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar238 = ZEXT1664(auVar36);
                                    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar237 = ZEXT1664(auVar36);
                                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar236 = ZEXT3264(auVar59);
                                    auVar72._16_16_ = auVar59._16_16_;
                                    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar235 = ZEXT1664(auVar36);
                                    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar234 = ZEXT1664(auVar36);
                                    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar233 = ZEXT1664(auVar36);
                                    if (*local_278.valid != 0) goto LAB_01cc608e;
LAB_01cc61a5:
                                    auVar243 = ZEXT464(0x3f800000);
                                    (ray->super_RayK<1>).tfar = fVar204;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
              }
            }
          }
          auVar240 = ZEXT1664(local_1b8);
          auVar242 = ZEXT1664(local_1c8);
          if ((uint)uVar24 == 0) break;
        } while( true );
      }
      fVar205 = (ray->super_RayK<1>).tfar;
      auVar15._4_4_ = fVar205;
      auVar15._0_4_ = fVar205;
      auVar15._8_4_ = fVar205;
      auVar15._12_4_ = fVar205;
      auVar15._16_4_ = fVar205;
      auVar15._20_4_ = fVar205;
      auVar15._24_4_ = fVar205;
      auVar15._28_4_ = fVar205;
      uVar10 = vcmpps_avx512vl(local_78,auVar15,2);
      uVar29 = (uint)uVar30 & (uint)uVar10;
      uVar30 = (ulong)uVar29;
    } while (uVar29 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }